

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  long lVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined3 uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  bool bVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined6 uVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  byte bVar37;
  ulong uVar38;
  ulong uVar39;
  RTCFilterFunctionN p_Var40;
  RTCRayN *pRVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  LinearSpace3fa *pLVar45;
  ulong uVar46;
  bool bVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  short sVar53;
  float t1;
  float fVar54;
  float fVar55;
  undefined2 uVar86;
  float fVar87;
  float fVar89;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  float fVar88;
  float fVar90;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar91;
  float fVar104;
  float fVar105;
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar106;
  float fVar123;
  float fVar124;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar137;
  float fVar138;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar144;
  float fVar145;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar146;
  float fVar160;
  float fVar161;
  vfloat4 a;
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar173;
  float fVar174;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar175;
  float fVar193;
  float fVar194;
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar195;
  float fVar206;
  float fVar207;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar208;
  float fVar215;
  float fVar216;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar217;
  float fVar222;
  float fVar223;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar235;
  float fVar238;
  vfloat4 a_1;
  undefined1 auVar227 [16];
  float fVar241;
  undefined1 auVar230 [16];
  float fVar236;
  float fVar237;
  float fVar239;
  float fVar240;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar244;
  float fVar245;
  float fVar250;
  float fVar252;
  float fVar254;
  undefined1 auVar246 [16];
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar256;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_52d;
  uint local_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  float local_4e8;
  float fStack_4e4;
  undefined8 local_4d8;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_458;
  LinearSpace3fa *local_450;
  ulong local_448;
  ulong local_440;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  ulong auStack_58 [5];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 uVar85;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar135 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  
  PVar5 = prim[1];
  uVar38 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar38 * 0x19 + 6;
  fVar124 = *(float *)(pPVar4 + 0xc);
  fVar125 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar124;
  fVar137 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar124;
  fVar138 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar124;
  fVar106 = *(float *)(ray + k * 4 + 0x40) * fVar124;
  fVar123 = *(float *)(ray + k * 4 + 0x50) * fVar124;
  fVar124 = *(float *)(ray + k * 4 + 0x60) * fVar124;
  uVar6 = *(undefined4 *)(prim + uVar38 * 4 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar153._8_4_ = 0;
  auVar153._0_8_ = uVar44;
  auVar153._12_2_ = uVar86;
  auVar153._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._8_2_ = 0;
  auVar152._0_8_ = uVar44;
  auVar152._10_2_ = uVar86;
  auVar63._10_6_ = auVar152._10_6_;
  auVar63._8_2_ = uVar86;
  auVar63._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar22._4_8_ = auVar63._8_8_;
  auVar22._2_2_ = uVar86;
  auVar22._0_2_ = uVar86;
  fVar91 = (float)((int)sVar53 >> 8);
  fVar104 = (float)(auVar22._0_4_ >> 0x18);
  fVar105 = (float)(auVar63._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar38 * 5 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar44;
  auVar56._12_2_ = uVar86;
  auVar56._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar264._12_4_ = auVar56._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar44;
  auVar264._10_2_ = uVar86;
  auVar110._10_6_ = auVar264._10_6_;
  auVar110._8_2_ = uVar86;
  auVar110._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar23._4_8_ = auVar110._8_8_;
  auVar23._2_2_ = uVar86;
  auVar23._0_2_ = uVar86;
  fVar139 = (float)((int)sVar53 >> 8);
  fVar144 = (float)(auVar23._0_4_ >> 0x18);
  fVar145 = (float)(auVar110._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar38 * 6 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar44;
  auVar59._12_2_ = uVar86;
  auVar59._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar44;
  auVar58._10_2_ = uVar86;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar86;
  auVar57._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar24._4_8_ = auVar57._8_8_;
  auVar24._2_2_ = uVar86;
  auVar24._0_2_ = uVar86;
  fVar162 = (float)((int)sVar53 >> 8);
  fVar173 = (float)(auVar24._0_4_ >> 0x18);
  fVar174 = (float)(auVar57._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar38 * 0xb + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar44;
  auVar62._12_2_ = uVar86;
  auVar62._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar44;
  auVar61._10_2_ = uVar86;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar86;
  auVar60._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar25._4_8_ = auVar60._8_8_;
  auVar25._2_2_ = uVar86;
  auVar25._0_2_ = uVar86;
  fVar54 = (float)((int)sVar53 >> 8);
  fVar87 = (float)(auVar25._0_4_ >> 0x18);
  fVar89 = (float)(auVar60._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar149._8_4_ = 0;
  auVar149._0_8_ = uVar44;
  auVar149._12_2_ = uVar86;
  auVar149._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._8_2_ = 0;
  auVar148._0_8_ = uVar44;
  auVar148._10_2_ = uVar86;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._8_2_ = uVar86;
  auVar147._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar26._4_8_ = auVar147._8_8_;
  auVar26._2_2_ = uVar86;
  auVar26._0_2_ = uVar86;
  fVar146 = (float)((int)sVar53 >> 8);
  fVar160 = (float)(auVar26._0_4_ >> 0x18);
  fVar161 = (float)(auVar147._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar38 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar44;
  auVar178._12_2_ = uVar86;
  auVar178._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar44;
  auVar177._10_2_ = uVar86;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar86;
  auVar176._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar27._4_8_ = auVar176._8_8_;
  auVar27._2_2_ = uVar86;
  auVar27._0_2_ = uVar86;
  fVar208 = (float)((int)sVar53 >> 8);
  fVar215 = (float)(auVar27._0_4_ >> 0x18);
  fVar216 = (float)(auVar176._8_4_ >> 0x18);
  uVar46 = (ulong)(uint)((int)(uVar38 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar46 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar44;
  auVar181._12_2_ = uVar86;
  auVar181._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar44;
  auVar180._10_2_ = uVar86;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar86;
  auVar179._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar28._4_8_ = auVar179._8_8_;
  auVar28._2_2_ = uVar86;
  auVar28._0_2_ = uVar86;
  fVar195 = (float)((int)sVar53 >> 8);
  fVar206 = (float)(auVar28._0_4_ >> 0x18);
  fVar207 = (float)(auVar179._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar46 + uVar38 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar44;
  auVar184._12_2_ = uVar86;
  auVar184._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar44;
  auVar183._10_2_ = uVar86;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar86;
  auVar182._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar29._4_8_ = auVar182._8_8_;
  auVar29._2_2_ = uVar86;
  auVar29._0_2_ = uVar86;
  fVar217 = (float)((int)sVar53 >> 8);
  fVar222 = (float)(auVar29._0_4_ >> 0x18);
  fVar223 = (float)(auVar182._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar38 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar39 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar21 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar85),uVar85);
  sVar53 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar21,sVar53);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar44;
  auVar229._12_2_ = uVar86;
  auVar229._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar44;
  auVar228._10_2_ = uVar86;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar86;
  auVar227._0_8_ = uVar44;
  uVar86 = (undefined2)uVar21;
  auVar30._4_8_ = auVar227._8_8_;
  auVar30._2_2_ = uVar86;
  auVar30._0_2_ = uVar86;
  fVar55 = (float)((int)sVar53 >> 8);
  fVar88 = (float)(auVar30._0_4_ >> 0x18);
  fVar90 = (float)(auVar227._8_4_ >> 0x18);
  fVar244 = fVar106 * fVar91 + fVar123 * fVar139 + fVar124 * fVar162;
  fVar250 = fVar106 * fVar104 + fVar123 * fVar144 + fVar124 * fVar173;
  fVar252 = fVar106 * fVar105 + fVar123 * fVar145 + fVar124 * fVar174;
  fVar254 = fVar106 * (float)(auVar152._12_4_ >> 0x18) +
            fVar123 * (float)(auVar264._12_4_ >> 0x18) + fVar124 * (float)(auVar58._12_4_ >> 0x18);
  fVar224 = fVar106 * fVar54 + fVar123 * fVar146 + fVar124 * fVar208;
  fVar235 = fVar106 * fVar87 + fVar123 * fVar160 + fVar124 * fVar215;
  fVar238 = fVar106 * fVar89 + fVar123 * fVar161 + fVar124 * fVar216;
  fVar241 = fVar106 * (float)(auVar61._12_4_ >> 0x18) +
            fVar123 * (float)(auVar148._12_4_ >> 0x18) + fVar124 * (float)(auVar177._12_4_ >> 0x18);
  fVar175 = fVar106 * fVar195 + fVar123 * fVar217 + fVar124 * fVar55;
  fVar193 = fVar106 * fVar206 + fVar123 * fVar222 + fVar124 * fVar88;
  fVar194 = fVar106 * fVar207 + fVar123 * fVar223 + fVar124 * fVar90;
  fVar106 = fVar106 * (float)(auVar180._12_4_ >> 0x18) +
            fVar123 * (float)(auVar183._12_4_ >> 0x18) + fVar124 * (float)(auVar228._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar139 = fVar91 * fVar125 + fVar139 * fVar137 + fVar162 * fVar138;
  fVar144 = fVar104 * fVar125 + fVar144 * fVar137 + fVar173 * fVar138;
  fVar145 = fVar105 * fVar125 + fVar145 * fVar137 + fVar174 * fVar138;
  fVar162 = (float)(auVar152._12_4_ >> 0x18) * fVar125 +
            (float)(auVar264._12_4_ >> 0x18) * fVar137 + (float)(auVar58._12_4_ >> 0x18) * fVar138;
  fVar173 = fVar54 * fVar125 + fVar146 * fVar137 + fVar208 * fVar138;
  fVar174 = fVar87 * fVar125 + fVar160 * fVar137 + fVar215 * fVar138;
  fVar208 = fVar89 * fVar125 + fVar161 * fVar137 + fVar216 * fVar138;
  fVar215 = (float)(auVar61._12_4_ >> 0x18) * fVar125 +
            (float)(auVar148._12_4_ >> 0x18) * fVar137 + (float)(auVar177._12_4_ >> 0x18) * fVar138;
  fVar146 = fVar125 * fVar195 + fVar137 * fVar217 + fVar138 * fVar55;
  fVar160 = fVar125 * fVar206 + fVar137 * fVar222 + fVar138 * fVar88;
  fVar161 = fVar125 * fVar207 + fVar137 * fVar223 + fVar138 * fVar90;
  fVar125 = fVar125 * (float)(auVar180._12_4_ >> 0x18) +
            fVar137 * (float)(auVar183._12_4_ >> 0x18) + fVar138 * (float)(auVar228._12_4_ >> 0x18);
  fVar124 = (float)DAT_01ff1d40;
  fVar54 = DAT_01ff1d40._4_4_;
  fVar55 = DAT_01ff1d40._8_4_;
  fVar87 = DAT_01ff1d40._12_4_;
  uVar48 = -(uint)(fVar124 <= ABS(fVar244));
  uVar49 = -(uint)(fVar54 <= ABS(fVar250));
  uVar51 = -(uint)(fVar55 <= ABS(fVar252));
  uVar52 = -(uint)(fVar87 <= ABS(fVar254));
  auVar246._0_4_ = (uint)fVar244 & uVar48;
  auVar246._4_4_ = (uint)fVar250 & uVar49;
  auVar246._8_4_ = (uint)fVar252 & uVar51;
  auVar246._12_4_ = (uint)fVar254 & uVar52;
  auVar140._0_4_ = ~uVar48 & (uint)fVar124;
  auVar140._4_4_ = ~uVar49 & (uint)fVar54;
  auVar140._8_4_ = ~uVar51 & (uint)fVar55;
  auVar140._12_4_ = ~uVar52 & (uint)fVar87;
  auVar140 = auVar140 | auVar246;
  uVar48 = -(uint)(fVar124 <= ABS(fVar224));
  uVar49 = -(uint)(fVar54 <= ABS(fVar235));
  uVar51 = -(uint)(fVar55 <= ABS(fVar238));
  uVar52 = -(uint)(fVar87 <= ABS(fVar241));
  auVar230._0_4_ = (uint)fVar224 & uVar48;
  auVar230._4_4_ = (uint)fVar235 & uVar49;
  auVar230._8_4_ = (uint)fVar238 & uVar51;
  auVar230._12_4_ = (uint)fVar241 & uVar52;
  auVar150._0_4_ = ~uVar48 & (uint)fVar124;
  auVar150._4_4_ = ~uVar49 & (uint)fVar54;
  auVar150._8_4_ = ~uVar51 & (uint)fVar55;
  auVar150._12_4_ = ~uVar52 & (uint)fVar87;
  auVar150 = auVar150 | auVar230;
  uVar48 = -(uint)(fVar124 <= ABS(fVar175));
  uVar49 = -(uint)(fVar54 <= ABS(fVar193));
  uVar51 = -(uint)(fVar55 <= ABS(fVar194));
  uVar52 = -(uint)(fVar87 <= ABS(fVar106));
  auVar185._0_4_ = (uint)fVar175 & uVar48;
  auVar185._4_4_ = (uint)fVar193 & uVar49;
  auVar185._8_4_ = (uint)fVar194 & uVar51;
  auVar185._12_4_ = (uint)fVar106 & uVar52;
  auVar163._0_4_ = ~uVar48 & (uint)fVar124;
  auVar163._4_4_ = ~uVar49 & (uint)fVar54;
  auVar163._8_4_ = ~uVar51 & (uint)fVar55;
  auVar163._12_4_ = ~uVar52 & (uint)fVar87;
  auVar163 = auVar163 | auVar185;
  auVar63 = rcpps(_DAT_01ff1d40,auVar140);
  fVar124 = auVar63._0_4_;
  fVar87 = auVar63._4_4_;
  fVar90 = auVar63._8_4_;
  fVar105 = auVar63._12_4_;
  fVar124 = (1.0 - auVar140._0_4_ * fVar124) * fVar124 + fVar124;
  fVar87 = (1.0 - auVar140._4_4_ * fVar87) * fVar87 + fVar87;
  fVar90 = (1.0 - auVar140._8_4_ * fVar90) * fVar90 + fVar90;
  fVar105 = (1.0 - auVar140._12_4_ * fVar105) * fVar105 + fVar105;
  auVar63 = rcpps(auVar63,auVar150);
  fVar54 = auVar63._0_4_;
  fVar88 = auVar63._4_4_;
  fVar91 = auVar63._8_4_;
  fVar106 = auVar63._12_4_;
  fVar54 = (1.0 - auVar150._0_4_ * fVar54) * fVar54 + fVar54;
  fVar88 = (1.0 - auVar150._4_4_ * fVar88) * fVar88 + fVar88;
  fVar91 = (1.0 - auVar150._8_4_ * fVar91) * fVar91 + fVar91;
  fVar106 = (1.0 - auVar150._12_4_ * fVar106) * fVar106 + fVar106;
  auVar63 = rcpps(auVar63,auVar163);
  fVar55 = auVar63._0_4_;
  fVar89 = auVar63._4_4_;
  fVar104 = auVar63._8_4_;
  fVar123 = auVar63._12_4_;
  fVar55 = (1.0 - auVar163._0_4_ * fVar55) * fVar55 + fVar55;
  fVar89 = (1.0 - auVar163._4_4_ * fVar89) * fVar89 + fVar89;
  fVar104 = (1.0 - auVar163._8_4_ * fVar104) * fVar104 + fVar104;
  fVar123 = (1.0 - auVar163._12_4_ * fVar123) * fVar123 + fVar123;
  uVar44 = *(ulong *)(prim + uVar38 * 7 + 6);
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar44;
  auVar66._12_2_ = uVar86;
  auVar66._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar44;
  auVar65._10_2_ = uVar86;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar86;
  auVar64._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar31._4_8_ = auVar64._8_8_;
  auVar31._2_2_ = uVar86;
  auVar31._0_2_ = uVar86;
  auVar141._0_8_ =
       CONCAT44(((float)(auVar31._0_4_ >> 0x10) - fVar144) * fVar87,
                ((float)(int)(short)uVar44 - fVar139) * fVar124);
  auVar141._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar145) * fVar90;
  auVar141._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar162) * fVar105;
  uVar44 = *(ulong *)(prim + uVar38 * 9 + 6);
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar44;
  auVar69._12_2_ = uVar86;
  auVar69._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar44;
  auVar68._10_2_ = uVar86;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar86;
  auVar67._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar32._4_8_ = auVar67._8_8_;
  auVar32._2_2_ = uVar86;
  auVar32._0_2_ = uVar86;
  auVar164._0_4_ = ((float)(int)(short)uVar44 - fVar139) * fVar124;
  auVar164._4_4_ = ((float)(auVar32._0_4_ >> 0x10) - fVar144) * fVar87;
  auVar164._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar145) * fVar90;
  auVar164._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar162) * fVar105;
  uVar44 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar46 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar38 * -2 + 6);
  uVar86 = (undefined2)(uVar46 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar46;
  auVar94._12_2_ = uVar86;
  auVar94._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar46 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar46;
  auVar93._10_2_ = uVar86;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar86;
  auVar92._0_8_ = uVar46;
  uVar86 = (undefined2)(uVar46 >> 0x10);
  auVar33._4_8_ = auVar92._8_8_;
  auVar33._2_2_ = uVar86;
  auVar33._0_2_ = uVar86;
  auVar95._0_8_ =
       CONCAT44(((float)(auVar33._0_4_ >> 0x10) - fVar174) * fVar88,
                ((float)(int)(short)uVar46 - fVar173) * fVar54);
  auVar95._8_4_ = ((float)(auVar92._8_4_ >> 0x10) - fVar208) * fVar91;
  auVar95._12_4_ = ((float)(auVar93._12_4_ >> 0x10) - fVar215) * fVar106;
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar44;
  auVar72._12_2_ = uVar86;
  auVar72._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar44;
  auVar71._10_2_ = uVar86;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar86;
  auVar70._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar34._4_8_ = auVar70._8_8_;
  auVar34._2_2_ = uVar86;
  auVar34._0_2_ = uVar86;
  auVar196._0_4_ = ((float)(int)(short)uVar44 - fVar173) * fVar54;
  auVar196._4_4_ = ((float)(auVar34._0_4_ >> 0x10) - fVar174) * fVar88;
  auVar196._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar208) * fVar91;
  auVar196._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar215) * fVar106;
  uVar44 = *(ulong *)(prim + uVar39 + uVar38 + 6);
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar44;
  auVar75._12_2_ = uVar86;
  auVar75._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar44;
  auVar74._10_2_ = uVar86;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar86;
  auVar73._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar35._4_8_ = auVar73._8_8_;
  auVar35._2_2_ = uVar86;
  auVar35._0_2_ = uVar86;
  auVar76._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar160) * fVar89,
                ((float)(int)(short)uVar44 - fVar146) * fVar55);
  auVar76._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar161) * fVar104;
  auVar76._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar125) * fVar123;
  uVar44 = *(ulong *)(prim + uVar38 * 0x17 + 6);
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar44;
  auVar188._12_2_ = uVar86;
  auVar188._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar44;
  auVar187._10_2_ = uVar86;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar86;
  auVar186._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar36._4_8_ = auVar186._8_8_;
  auVar36._2_2_ = uVar86;
  auVar36._0_2_ = uVar86;
  auVar189._0_4_ = ((float)(int)(short)uVar44 - fVar146) * fVar55;
  auVar189._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar160) * fVar89;
  auVar189._8_4_ = ((float)(auVar186._8_4_ >> 0x10) - fVar161) * fVar104;
  auVar189._12_4_ = ((float)(auVar187._12_4_ >> 0x10) - fVar125) * fVar123;
  auVar151._8_4_ = auVar141._8_4_;
  auVar151._0_8_ = auVar141._0_8_;
  auVar151._12_4_ = auVar141._12_4_;
  auVar152 = minps(auVar151,auVar164);
  auVar107._8_4_ = auVar95._8_4_;
  auVar107._0_8_ = auVar95._0_8_;
  auVar107._12_4_ = auVar95._12_4_;
  auVar63 = minps(auVar107,auVar196);
  auVar152 = maxps(auVar152,auVar63);
  auVar108._8_4_ = auVar76._8_4_;
  auVar108._0_8_ = auVar76._0_8_;
  auVar108._12_4_ = auVar76._12_4_;
  auVar63 = minps(auVar108,auVar189);
  auVar126._4_4_ = uVar6;
  auVar126._0_4_ = uVar6;
  auVar126._8_4_ = uVar6;
  auVar126._12_4_ = uVar6;
  auVar63 = maxps(auVar63,auVar126);
  auVar153 = maxps(auVar152,auVar63);
  auVar152 = maxps(auVar141,auVar164);
  auVar63 = maxps(auVar95,auVar196);
  auVar152 = minps(auVar152,auVar63);
  auVar63 = maxps(auVar76,auVar189);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar96._4_4_ = uVar6;
  auVar96._0_4_ = uVar6;
  auVar96._8_4_ = uVar6;
  auVar96._12_4_ = uVar6;
  auVar63 = minps(auVar63,auVar96);
  local_298 = auVar153._0_4_ * 0.99999964;
  fStack_294 = auVar153._4_4_ * 0.99999964;
  fStack_290 = auVar153._8_4_ * 0.99999964;
  fStack_28c = auVar153._12_4_ * 0.99999964;
  auVar63 = minps(auVar152,auVar63);
  auVar77._0_4_ = -(uint)(local_298 <= auVar63._0_4_ * 1.0000004 && PVar5 != (Primitive)0x0);
  auVar77._4_4_ = -(uint)(fStack_294 <= auVar63._4_4_ * 1.0000004 && 1 < (byte)PVar5);
  auVar77._8_4_ = -(uint)(fStack_290 <= auVar63._8_4_ * 1.0000004 && 2 < (byte)PVar5);
  auVar77._12_4_ = -(uint)(fStack_28c <= auVar63._12_4_ * 1.0000004 && 3 < (byte)PVar5);
  uVar48 = movmskps((uint)(byte)PVar5,auVar77);
  local_52d = uVar48 != 0;
  if (uVar48 == 0) {
    return local_52d;
  }
  uVar48 = uVar48 & 0xff;
  pLVar45 = pre->ray_space + k;
  local_278._0_12_ = mm_lookupmask_ps._240_12_;
  local_278._12_4_ = 0;
  local_458 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_508 = context;
  local_450 = pLVar45;
LAB_00b52bd4:
  lVar10 = 0;
  if ((ulong)uVar48 != 0) {
    for (; (uVar48 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  local_2e8 = *(uint *)(prim + 2);
  local_448 = (ulong)local_2e8;
  local_2f8 = *(uint *)(prim + lVar10 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[local_448].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar44 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)local_2f8 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar44);
  fVar124 = *pfVar1;
  fVar54 = pfVar1[1];
  fVar55 = pfVar1[2];
  fVar87 = pfVar1[3];
  lVar10 = uVar44 + 1;
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar10);
  fVar88 = *pfVar1;
  fVar89 = pfVar1[1];
  fVar90 = pfVar1[2];
  fVar91 = pfVar1[3];
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * uVar44);
  fVar104 = *pfVar1;
  fVar105 = pfVar1[1];
  fVar106 = pfVar1[2];
  fVar123 = pfVar1[3];
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * lVar10);
  fVar139 = *pfVar1;
  fVar144 = pfVar1[1];
  fVar145 = pfVar1[2];
  fVar162 = pfVar1[3];
  pfVar1 = (float *)((long)pGVar7[3].userPtr + uVar44 * *(long *)&pGVar7[3].fnumTimeSegments);
  pfVar2 = (float *)((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar10);
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar44);
  local_1c8 = *(float *)(ray + k * 4);
  fStack_1c4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1c0 = *(float *)(ray + k * 4 + 0x20);
  fVar146 = *pfVar3 * 0.33333334 + fVar124;
  fVar160 = pfVar3[1] * 0.33333334 + fVar54;
  fVar161 = pfVar3[2] * 0.33333334 + fVar55;
  fVar125 = pfVar3[3] * 0.33333334 + fVar87;
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar10);
  fVar175 = fVar88 - *pfVar3 * 0.33333334;
  fVar194 = fVar89 - pfVar3[1] * 0.33333334;
  fVar206 = fVar90 - pfVar3[2] * 0.33333334;
  fVar208 = fVar91 - pfVar3[3] * 0.33333334;
  fVar216 = *pfVar1 * 0.33333334 + fVar104;
  fVar217 = pfVar1[1] * 0.33333334 + fVar105;
  fVar222 = pfVar1[2] * 0.33333334 + fVar106;
  fVar223 = pfVar1[3] * 0.33333334 + fVar123;
  fVar224 = fVar139 - *pfVar2 * 0.33333334;
  fVar235 = fVar144 - pfVar2[1] * 0.33333334;
  fVar238 = fVar145 - pfVar2[2] * 0.33333334;
  fVar241 = fVar162 - pfVar2[3] * 0.33333334;
  fVar137 = fVar175 * 0.0;
  fVar138 = fVar194 * 0.0;
  fVar173 = fVar206 * 0.0;
  fVar174 = fVar208 * 0.0;
  fVar244 = fVar88 * 0.0 + fVar137;
  fVar250 = fVar89 * 0.0 + fVar138;
  fVar252 = fVar90 * 0.0 + fVar173;
  fVar254 = fVar91 * 0.0 + fVar174;
  fVar225 = fVar146 * 0.0;
  fVar236 = fVar160 * 0.0;
  fVar239 = fVar161 * 0.0;
  fVar242 = fVar125 * 0.0;
  fVar193 = fVar225 + fVar244 + fVar124;
  fVar195 = fVar236 + fVar250 + fVar54;
  fVar207 = fVar239 + fVar252 + fVar55;
  fVar215 = fVar242 + fVar254 + fVar87;
  fVar146 = (fVar146 * 3.0 + fVar244) - fVar124 * 3.0;
  fVar160 = (fVar160 * 3.0 + fVar250) - fVar54 * 3.0;
  fVar161 = (fVar161 * 3.0 + fVar252) - fVar55 * 3.0;
  fVar125 = (fVar125 * 3.0 + fVar254) - fVar87 * 3.0;
  fVar226 = fVar224 * 0.0;
  fVar237 = fVar235 * 0.0;
  fVar240 = fVar238 * 0.0;
  fVar243 = fVar241 * 0.0;
  fVar244 = fVar139 * 0.0 + fVar226;
  fVar250 = fVar144 * 0.0 + fVar237;
  fVar252 = fVar145 * 0.0 + fVar240;
  fVar254 = fVar162 * 0.0 + fVar243;
  fVar245 = fVar216 * 0.0;
  fVar251 = fVar217 * 0.0;
  fVar253 = fVar222 * 0.0;
  fVar255 = fVar223 * 0.0;
  fVar256 = fVar245 + fVar244 + fVar104;
  fVar260 = fVar251 + fVar250 + fVar105;
  fVar261 = fVar253 + fVar252 + fVar106;
  fVar262 = fVar255 + fVar254 + fVar123;
  fVar216 = (fVar216 * 3.0 + fVar244) - fVar104 * 3.0;
  fVar217 = (fVar217 * 3.0 + fVar250) - fVar105 * 3.0;
  fVar222 = (fVar222 * 3.0 + fVar252) - fVar106 * 3.0;
  fVar223 = (fVar223 * 3.0 + fVar254) - fVar123 * 3.0;
  fVar137 = fVar137 + fVar88 + fVar225 + fVar124 * 0.0;
  fVar138 = fVar138 + fVar89 + fVar236 + fVar54 * 0.0;
  fVar173 = fVar173 + fVar90 + fVar239 + fVar55 * 0.0;
  fVar174 = fVar174 + fVar91 + fVar242 + fVar87 * 0.0;
  fVar124 = ((fVar88 * 3.0 - fVar175 * 3.0) + fVar225) - fVar124 * 0.0;
  fVar54 = ((fVar89 * 3.0 - fVar194 * 3.0) + fVar236) - fVar54 * 0.0;
  fVar55 = ((fVar90 * 3.0 - fVar206 * 3.0) + fVar239) - fVar55 * 0.0;
  fVar87 = ((fVar91 * 3.0 - fVar208 * 3.0) + fVar242) - fVar87 * 0.0;
  fVar175 = fVar226 + fVar139 + fVar245 + fVar104 * 0.0;
  fVar194 = fVar237 + fVar144 + fVar251 + fVar105 * 0.0;
  fVar206 = fVar240 + fVar145 + fVar253 + fVar106 * 0.0;
  fVar208 = fVar243 + fVar162 + fVar255 + fVar123 * 0.0;
  fVar88 = ((fVar139 * 3.0 - fVar224 * 3.0) + fVar245) - fVar104 * 0.0;
  fVar89 = ((fVar144 * 3.0 - fVar235 * 3.0) + fVar251) - fVar105 * 0.0;
  fVar90 = ((fVar145 * 3.0 - fVar238 * 3.0) + fVar253) - fVar106 * 0.0;
  fVar91 = ((fVar162 * 3.0 - fVar241 * 3.0) + fVar255) - fVar123 * 0.0;
  fVar224 = fVar160 * fVar256 - fVar260 * fVar146;
  fVar238 = fVar161 * fVar260 - fVar261 * fVar160;
  fVar241 = fVar146 * fVar261 - fVar256 * fVar161;
  fVar244 = fVar125 * fVar262 - fVar262 * fVar125;
  fVar105 = fVar160 * fVar216 - fVar217 * fVar146;
  fVar139 = fVar161 * fVar217 - fVar222 * fVar160;
  fVar145 = fVar146 * fVar222 - fVar216 * fVar161;
  fVar162 = fVar54 * fVar175 - fVar194 * fVar124;
  fVar194 = fVar55 * fVar194 - fVar206 * fVar54;
  fVar206 = fVar124 * fVar206 - fVar175 * fVar55;
  fVar208 = fVar87 * fVar208 - fVar208 * fVar87;
  fVar104 = fVar54 * fVar88 - fVar89 * fVar124;
  fVar89 = fVar55 * fVar89 - fVar90 * fVar54;
  fVar123 = fVar124 * fVar90 - fVar88 * fVar55;
  fVar217 = fVar241 * fVar241 + fVar238 * fVar238 + fVar224 * fVar224;
  auVar152 = ZEXT416((uint)fVar217);
  auVar63 = rsqrtss(ZEXT416((uint)fVar217),auVar152);
  fVar88 = auVar63._0_4_;
  fVar222 = fVar88 * 1.5 - fVar88 * fVar88 * fVar217 * 0.5 * fVar88;
  fVar250 = fVar224 * fVar105 + fVar241 * fVar145 + fVar238 * fVar139;
  fVar88 = fVar244 * fVar222;
  auVar63 = rcpss(auVar152,auVar152);
  fVar90 = (2.0 - fVar217 * auVar63._0_4_) * auVar63._0_4_;
  fVar216 = fVar206 * fVar206 + fVar194 * fVar194 + fVar162 * fVar162;
  auVar63 = ZEXT416((uint)fVar216);
  auVar152 = rsqrtss(ZEXT416((uint)fVar216),auVar63);
  fVar106 = auVar152._0_4_;
  fVar175 = fVar106 * 1.5 - fVar106 * fVar106 * fVar216 * 0.5 * fVar106;
  fVar235 = fVar162 * fVar104 + fVar206 * fVar123 + fVar194 * fVar89;
  fVar144 = fVar208 * fVar175;
  auVar63 = rcpss(auVar63,auVar63);
  fVar106 = (2.0 - fVar216 * auVar63._0_4_) * auVar63._0_4_;
  local_3f8 = fVar215 * fVar238 * fVar222;
  fStack_3f4 = fVar215 * fVar241 * fVar222;
  fStack_3f0 = fVar215 * fVar224 * fVar222;
  fStack_3ec = fVar215 * fVar88;
  local_408 = fVar193 - local_3f8;
  fStack_404 = fVar195 - fStack_3f4;
  fStack_400 = fVar207 - fStack_3f0;
  fStack_3fc = fVar215 - fStack_3ec;
  fVar238 = fVar215 * fVar90 * (fVar217 * fVar139 - fVar250 * fVar238) * fVar222 +
            fVar125 * fVar238 * fVar222;
  fVar241 = fVar215 * fVar90 * (fVar217 * fVar145 - fVar250 * fVar241) * fVar222 +
            fVar125 * fVar241 * fVar222;
  fVar224 = fVar215 * fVar90 * (fVar217 * fVar105 - fVar250 * fVar224) * fVar222 +
            fVar125 * fVar224 * fVar222;
  fVar217 = fVar215 * fVar90 * (fVar217 * (fVar125 * fVar223 - fVar223 * fVar125) -
                               fVar250 * fVar244) * fVar222 + fVar125 * fVar88;
  local_3f8 = local_3f8 + fVar193;
  fStack_3f4 = fStack_3f4 + fVar195;
  fStack_3f0 = fStack_3f0 + fVar207;
  fStack_3ec = fStack_3ec + fVar215;
  fVar90 = fVar174 * fVar194 * fVar175;
  fVar105 = fVar174 * fVar206 * fVar175;
  fVar139 = fVar174 * fVar162 * fVar175;
  fVar145 = fVar174 * fVar144;
  local_428 = fVar137 - fVar90;
  fStack_424 = fVar138 - fVar105;
  fStack_420 = fVar173 - fVar139;
  fStack_41c = fVar174 - fVar145;
  fVar88 = fVar174 * fVar106 * (fVar216 * fVar89 - fVar235 * fVar194) * fVar175 +
           fVar87 * fVar194 * fVar175;
  fVar89 = fVar174 * fVar106 * (fVar216 * fVar123 - fVar235 * fVar206) * fVar175 +
           fVar87 * fVar206 * fVar175;
  fVar104 = fVar174 * fVar106 * (fVar216 * fVar104 - fVar235 * fVar162) * fVar175 +
            fVar87 * fVar162 * fVar175;
  fVar123 = fVar174 * fVar106 * (fVar216 * (fVar87 * fVar91 - fVar91 * fVar87) - fVar235 * fVar208)
                      * fVar175 + fVar87 * fVar144;
  fVar90 = fVar90 + fVar137;
  fVar105 = fVar105 + fVar138;
  fVar139 = fVar139 + fVar173;
  fVar145 = fVar145 + fVar174;
  local_418 = (fVar146 - fVar238) * 0.33333334 + local_408;
  fStack_414 = (fVar160 - fVar241) * 0.33333334 + fStack_404;
  fStack_410 = (fVar161 - fVar224) * 0.33333334 + fStack_400;
  fStack_40c = (fVar125 - fVar217) * 0.33333334 + fStack_3fc;
  local_438 = local_428 - (fVar124 - fVar88) * 0.33333334;
  fStack_434 = fStack_424 - (fVar54 - fVar89) * 0.33333334;
  fStack_430 = fStack_420 - (fVar55 - fVar104) * 0.33333334;
  fStack_42c = fStack_41c - (fVar87 - fVar123) * 0.33333334;
  fVar91 = fVar90 - (fVar88 + fVar124) * 0.33333334;
  fVar106 = fVar105 - (fVar89 + fVar54) * 0.33333334;
  fVar144 = fVar139 - (fVar104 + fVar55) * 0.33333334;
  fVar162 = fVar145 - (fVar123 + fVar87) * 0.33333334;
  local_158 = local_408 - local_1c8;
  fStack_154 = fStack_404 - fStack_1c4;
  fStack_150 = fStack_400 - fStack_1c0;
  fStack_14c = fStack_3fc - 0.0;
  fVar124 = (pLVar45->vx).field_0.m128[0];
  fVar54 = (pLVar45->vx).field_0.m128[1];
  fVar55 = (pLVar45->vy).field_0.m128[0];
  fVar87 = (pLVar45->vy).field_0.m128[1];
  fVar88 = (pLVar45->vz).field_0.m128[0];
  fVar89 = (pLVar45->vz).field_0.m128[1];
  fVar104 = local_158 * fVar124 + fStack_154 * fVar55 + fStack_150 * fVar88;
  fVar123 = local_158 * fVar54 + fStack_154 * fVar87 + fStack_150 * fVar89;
  local_168 = local_418 - local_1c8;
  fStack_164 = fStack_414 - fStack_1c4;
  fStack_160 = fStack_410 - fStack_1c0;
  fStack_15c = fStack_40c - 0.0;
  fVar194 = local_168 * fVar124 + fStack_164 * fVar55 + fStack_160 * fVar88;
  fVar195 = local_168 * fVar54 + fStack_164 * fVar87 + fStack_160 * fVar89;
  local_348 = CONCAT44(fVar195,fVar194);
  local_178 = local_438 - local_1c8;
  fStack_174 = fStack_434 - fStack_1c4;
  fStack_170 = fStack_430 - fStack_1c0;
  fStack_16c = fStack_42c - 0.0;
  fVar175 = local_178 * fVar124 + fStack_174 * fVar55 + fStack_170 * fVar88;
  fVar193 = local_178 * fVar54 + fStack_174 * fVar87 + fStack_170 * fVar89;
  local_358 = CONCAT44(fVar193,fVar175);
  local_188 = local_428 - local_1c8;
  fStack_184 = fStack_424 - fStack_1c4;
  fStack_180 = fStack_420 - fStack_1c0;
  fStack_17c = fStack_41c - 0.0;
  fVar173 = local_188 * fVar124 + fStack_184 * fVar55 + fStack_180 * fVar88;
  fVar174 = local_188 * fVar54 + fStack_184 * fVar87 + fStack_180 * fVar89;
  local_368 = CONCAT44(fVar174,fVar173);
  local_198 = local_3f8 - local_1c8;
  fStack_194 = fStack_3f4 - fStack_1c4;
  fStack_190 = fStack_3f0 - fStack_1c0;
  fStack_18c = fStack_3ec - 0.0;
  fVar137 = local_198 * fVar124 + fStack_194 * fVar55 + fStack_190 * fVar88;
  fVar138 = local_198 * fVar54 + fStack_194 * fVar87 + fStack_190 * fVar89;
  local_288 = (fVar238 + fVar146) * 0.33333334 + local_3f8;
  fStack_284 = (fVar241 + fVar160) * 0.33333334 + fStack_3f4;
  fStack_280 = (fVar224 + fVar161) * 0.33333334 + fStack_3f0;
  fStack_27c = (fVar217 + fVar125) * 0.33333334 + fStack_3ec;
  local_1a8 = local_288 - local_1c8;
  fStack_1a4 = fStack_284 - fStack_1c4;
  fStack_1a0 = fStack_280 - fStack_1c0;
  fStack_19c = fStack_27c - 0.0;
  fVar161 = local_1a8 * fVar124 + fStack_1a4 * fVar55 + fStack_1a0 * fVar88;
  fVar125 = local_1a8 * fVar54 + fStack_1a4 * fVar87 + fStack_1a0 * fVar89;
  local_388 = CONCAT44(fVar125,fVar161);
  local_1b8 = fVar91 - local_1c8;
  fStack_1b4 = fVar106 - fStack_1c4;
  fStack_1b0 = fVar144 - fStack_1c0;
  fStack_1ac = fVar162 - 0.0;
  fVar146 = local_1b8 * fVar124 + fStack_1b4 * fVar55 + fStack_1b0 * fVar88;
  fVar160 = local_1b8 * fVar54 + fStack_1b4 * fVar87 + fStack_1b0 * fVar89;
  local_1c8 = fVar90 - local_1c8;
  fStack_1c4 = fVar105 - fStack_1c4;
  fStack_1c0 = fVar139 - fStack_1c0;
  fStack_1bc = fVar145 - 0.0;
  fVar124 = local_1c8 * fVar124 + fStack_1c4 * fVar55 + fStack_1c0 * fVar88;
  fVar54 = local_1c8 * fVar54 + fStack_1c4 * fVar87 + fStack_1c0 * fVar89;
  local_3a8 = CONCAT44(fVar54,fVar124);
  auVar231._8_8_ = local_388;
  auVar231._0_8_ = local_348;
  register0x000012c8 = local_3a8;
  local_3b8 = local_368;
  auVar78._8_4_ = fVar137;
  auVar78._0_8_ = CONCAT44(fVar123,fVar104);
  auVar78._12_4_ = fVar138;
  auVar63 = minps(auVar78,auVar231);
  auVar97._8_4_ = fVar146;
  auVar97._0_8_ = local_358;
  auVar97._12_4_ = fVar160;
  auVar152 = minps(auVar97,_local_3b8);
  auVar63 = minps(auVar63,auVar152);
  auVar98._8_4_ = fVar137;
  auVar98._0_8_ = CONCAT44(fVar123,fVar104);
  auVar98._12_4_ = fVar138;
  auVar152 = maxps(auVar98,auVar231);
  auVar109._4_4_ = fVar193;
  auVar109._0_4_ = fVar175;
  auVar109._8_4_ = fVar146;
  auVar109._12_4_ = fVar160;
  auVar110 = maxps(auVar109,_local_3b8);
  auVar153 = maxps(auVar152,auVar110);
  auVar11._4_8_ = auVar110._8_8_;
  auVar11._0_4_ = auVar63._4_4_;
  auVar111._0_8_ = auVar11._0_8_ << 0x20;
  auVar111._8_4_ = auVar63._8_4_;
  auVar111._12_4_ = auVar63._12_4_;
  auVar112._8_8_ = auVar63._8_8_;
  auVar112._0_8_ = auVar111._8_8_;
  auVar152 = minps(auVar63,auVar112);
  auVar12._4_8_ = auVar63._8_8_;
  auVar12._0_4_ = auVar153._4_4_;
  auVar113._0_8_ = auVar12._0_8_ << 0x20;
  auVar113._8_4_ = auVar153._8_4_;
  auVar113._12_4_ = auVar153._12_4_;
  auVar114._8_8_ = auVar153._8_8_;
  auVar114._0_8_ = auVar113._8_8_;
  auVar63 = maxps(auVar153,auVar114);
  auVar79._0_8_ = auVar152._0_8_ & 0x7fffffff7fffffff;
  auVar79._8_4_ = auVar152._8_4_ & 0x7fffffff;
  auVar79._12_4_ = auVar152._12_4_ & 0x7fffffff;
  auVar99._0_8_ = auVar63._0_8_ & 0x7fffffff7fffffff;
  auVar99._8_4_ = auVar63._8_4_ & 0x7fffffff;
  auVar99._12_4_ = auVar63._12_4_ & 0x7fffffff;
  auVar63 = maxps(auVar79,auVar99);
  fStack_144 = auVar63._4_4_;
  local_258 = fStack_144;
  if (fStack_144 <= auVar63._0_4_) {
    local_258 = auVar63._0_4_;
  }
  uVar44 = (ulong)uVar48 + 0xf;
  local_258 = local_258 * 9.536743e-07;
  fStack_254 = local_258;
  fStack_250 = local_258;
  fStack_24c = local_258;
  local_268 = -local_258;
  fStack_264 = -local_258;
  fStack_260 = -local_258;
  fStack_25c = -local_258;
  local_118 = fVar194 - fVar104;
  fStack_114 = fVar195 - fVar123;
  fStack_110 = fVar161 - fVar137;
  fStack_10c = fVar125 - fVar138;
  local_128 = fVar175 - fVar194;
  fStack_124 = fVar193 - fVar195;
  fStack_120 = fVar146 - fVar161;
  fStack_11c = fVar160 - fVar125;
  local_138 = fVar173 - fVar175;
  fStack_134 = fVar174 - fVar193;
  fStack_130 = fVar124 - fVar146;
  fStack_12c = fVar54 - fVar160;
  local_2a8 = local_3f8 - local_408;
  fStack_2a4 = fStack_3f4 - fStack_404;
  fStack_2a0 = fStack_3f0 - fStack_400;
  fStack_29c = fStack_3ec - fStack_3fc;
  local_2b8 = local_288 - local_418;
  fStack_2b4 = fStack_284 - fStack_414;
  fStack_2b0 = fStack_280 - fStack_410;
  fStack_2ac = fStack_27c - fStack_40c;
  local_2c8 = fVar91 - local_438;
  fStack_2c4 = fVar106 - fStack_434;
  fStack_2c0 = fVar144 - fStack_430;
  fStack_2bc = fVar162 - fStack_42c;
  local_2d8 = fVar90 - local_428;
  fStack_2d4 = fVar105 - fStack_424;
  fStack_2d0 = fVar139 - fStack_420;
  fStack_2cc = fVar145 - fStack_41c;
  uStack_2e4 = local_2e8;
  uStack_2e0 = local_2e8;
  uStack_2dc = local_2e8;
  uStack_2f4 = local_2f8;
  uStack_2f0 = local_2f8;
  uStack_2ec = local_2f8;
  local_52c = 0;
  uVar46 = 0;
  fVar124 = *(float *)(ray + k * 4 + 0x30);
  _local_528 = ZEXT816(0x3f80000000000000);
  local_4d8 = 0x3f80000000000000;
  local_148 = local_258;
  fStack_140 = fStack_144;
  fStack_13c = fStack_144;
  context = local_508;
  local_4e8 = fVar104;
  fStack_4e4 = fVar123;
  local_440 = uVar44;
  uStack_3a0 = local_3a8;
  uStack_380 = local_388;
  uStack_360 = local_368;
  uStack_350 = local_358;
  uStack_340 = local_348;
  local_378 = fVar137;
  fStack_374 = fVar138;
  fStack_370 = fVar137;
  fStack_36c = fVar138;
  local_398 = fVar146;
  fStack_394 = fVar160;
  fStack_390 = fVar146;
  fStack_38c = fVar160;
  do {
    fVar54 = 1.0 - (float)local_528._0_4_;
    fVar55 = 1.0 - (float)local_528._0_4_;
    fVar87 = 1.0 - (float)local_528._4_4_;
    fVar88 = 1.0 - (float)local_528._4_4_;
    fVar89 = local_4e8 * fVar54 + local_378 * (float)local_528._0_4_;
    fVar215 = fStack_4e4 * fVar55 + fStack_374 * (float)local_528._0_4_;
    fVar217 = fVar104 * fVar87 + fStack_370 * (float)local_528._4_4_;
    fVar224 = fVar123 * fVar88 + fStack_36c * (float)local_528._4_4_;
    fVar206 = (float)local_348 * fVar54 + (float)local_388 * (float)local_528._0_4_;
    fVar222 = local_348._4_4_ * fVar55 + local_388._4_4_ * (float)local_528._0_4_;
    fVar250 = (float)uStack_340 * fVar87 + (float)uStack_380 * (float)local_528._4_4_;
    fVar252 = uStack_340._4_4_ * fVar88 + uStack_380._4_4_ * (float)local_528._4_4_;
    fVar241 = (float)local_358 * fVar54 + local_398 * (float)local_528._0_4_;
    fVar244 = local_358._4_4_ * fVar55 + fStack_394 * (float)local_528._0_4_;
    fVar254 = (float)uStack_350 * fVar87 + fStack_390 * (float)local_528._4_4_;
    fVar236 = uStack_350._4_4_ * fVar88 + fStack_38c * (float)local_528._4_4_;
    fVar225 = fVar54 * (float)local_368 + (float)local_528._0_4_ * (float)local_3a8;
    fVar226 = fVar55 * local_368._4_4_ + (float)local_528._0_4_ * local_3a8._4_4_;
    fVar255 = fVar87 * (float)uStack_360 + (float)local_528._4_4_ * (float)uStack_3a0;
    fVar256 = fVar88 * uStack_360._4_4_ + (float)local_528._4_4_ * uStack_3a0._4_4_;
    fVar54 = (local_4d8._4_4_ - (float)local_4d8) * 0.11111111;
    fVar237 = (local_4d8._4_4_ - (float)local_4d8) * 0.0 + (float)local_4d8;
    fVar239 = (local_4d8._4_4_ - (float)local_4d8) * 0.33333334 + (float)local_4d8;
    fVar240 = (local_4d8._4_4_ - (float)local_4d8) * 0.6666667 + (float)local_4d8;
    fVar242 = (local_4d8._4_4_ - (float)local_4d8) * 1.0 + (float)local_4d8;
    fVar243 = 1.0 - fVar237;
    fVar245 = 1.0 - fVar239;
    fVar251 = 1.0 - fVar240;
    fVar253 = 1.0 - fVar242;
    fVar145 = fVar206 * fVar243 + fVar241 * fVar237;
    fVar162 = fVar206 * fVar245 + fVar241 * fVar239;
    fVar173 = fVar206 * fVar251 + fVar241 * fVar240;
    fVar174 = fVar206 * fVar253 + fVar241 * fVar242;
    fVar216 = fVar222 * fVar243 + fVar244 * fVar237;
    fVar223 = fVar222 * fVar245 + fVar244 * fVar239;
    fVar235 = fVar222 * fVar251 + fVar244 * fVar240;
    fVar238 = fVar222 * fVar253 + fVar244 * fVar242;
    fVar55 = (fVar89 * fVar243 + fVar206 * fVar237) * fVar243 + fVar237 * fVar145;
    fVar87 = (fVar89 * fVar245 + fVar206 * fVar239) * fVar245 + fVar239 * fVar162;
    fVar88 = (fVar89 * fVar251 + fVar206 * fVar240) * fVar251 + fVar240 * fVar173;
    fVar89 = (fVar89 * fVar253 + fVar206 * fVar242) * fVar253 + fVar242 * fVar174;
    fVar206 = (fVar215 * fVar243 + fVar222 * fVar237) * fVar243 + fVar237 * fVar216;
    fVar207 = (fVar215 * fVar245 + fVar222 * fVar239) * fVar245 + fVar239 * fVar223;
    fVar208 = (fVar215 * fVar251 + fVar222 * fVar240) * fVar251 + fVar240 * fVar235;
    fVar215 = (fVar215 * fVar253 + fVar222 * fVar242) * fVar253 + fVar242 * fVar238;
    fVar145 = fVar145 * fVar243 + (fVar241 * fVar243 + fVar225 * fVar237) * fVar237;
    fVar162 = fVar162 * fVar245 + (fVar241 * fVar245 + fVar225 * fVar239) * fVar239;
    fVar173 = fVar173 * fVar251 + (fVar241 * fVar251 + fVar225 * fVar240) * fVar240;
    fVar174 = fVar174 * fVar253 + (fVar241 * fVar253 + fVar225 * fVar242) * fVar242;
    fVar222 = fVar216 * fVar243 + (fVar244 * fVar243 + fVar226 * fVar237) * fVar237;
    fVar216 = fVar223 * fVar245 + (fVar244 * fVar245 + fVar226 * fVar239) * fVar239;
    fVar223 = fVar235 * fVar251 + (fVar244 * fVar251 + fVar226 * fVar240) * fVar240;
    fVar235 = fVar238 * fVar253 + (fVar244 * fVar253 + fVar226 * fVar242) * fVar242;
    local_3e8 = fVar243 * fVar55 + fVar237 * fVar145;
    fStack_3e4 = fVar245 * fVar87 + fVar239 * fVar162;
    fStack_3e0 = fVar251 * fVar88 + fVar240 * fVar173;
    fStack_3dc = fVar253 * fVar89 + fVar242 * fVar174;
    local_3d8 = fVar243 * fVar206 + fVar237 * fVar222;
    fStack_3d4 = fVar245 * fVar207 + fVar239 * fVar216;
    fStack_3d0 = fVar251 * fVar208 + fVar240 * fVar223;
    fStack_3cc = fVar253 * fVar215 + fVar242 * fVar235;
    fVar162 = (fVar162 - fVar87) * 3.0 * fVar54;
    fVar88 = (fVar173 - fVar88) * 3.0 * fVar54;
    fVar89 = (fVar174 - fVar89) * 3.0 * fVar54;
    fVar174 = (fVar216 - fVar207) * 3.0 * fVar54;
    fVar223 = (fVar223 - fVar208) * 3.0 * fVar54;
    fVar215 = (fVar235 - fVar215) * 3.0 * fVar54;
    local_1f8._4_4_ = fStack_3e0;
    local_1f8._0_4_ = fStack_3e4;
    local_1d8._4_4_ = fStack_3d0;
    local_1d8._0_4_ = fStack_3d4;
    fVar173 = local_3e8 + (fVar145 - fVar55) * 3.0 * fVar54;
    fVar207 = fStack_3e4 + fVar162;
    fVar208 = fStack_3e0 + fVar88;
    fVar216 = fStack_3dc + fVar89;
    fVar55 = local_3d8 + (fVar222 - fVar206) * 3.0 * fVar54;
    fVar87 = fStack_3d4 + fVar174;
    fStack_510 = fStack_3d0 + fVar223;
    fStack_50c = fStack_3cc + fVar215;
    local_3c8._0_4_ = fStack_3e4 - fVar162;
    local_3c8._4_4_ = fStack_3e0 - fVar88;
    local_3c8._8_4_ = fStack_3dc - fVar89;
    local_3c8._12_4_ = 0;
    local_1d8._8_4_ = fStack_3cc;
    local_1d8._12_4_ = 0;
    local_1e8._0_4_ = fStack_3d4 - fVar174;
    local_1e8._4_4_ = fStack_3d0 - fVar223;
    local_1e8._8_4_ = fStack_3cc - fVar215;
    local_1e8._12_4_ = 0;
    fVar88 = fVar250 * fVar243 + fVar254 * fVar237;
    fVar89 = fVar250 * fVar245 + fVar254 * fVar239;
    fVar145 = fVar250 * fVar251 + fVar254 * fVar240;
    fVar162 = fVar250 * fVar253 + fVar254 * fVar242;
    fVar174 = fVar252 * fVar243 + fVar236 * fVar237;
    fVar206 = fVar252 * fVar245 + fVar236 * fVar239;
    fVar215 = fVar252 * fVar251 + fVar236 * fVar240;
    fVar226 = fVar252 * fVar253 + fVar236 * fVar242;
    fVar238 = (fVar217 * fVar243 + fVar250 * fVar237) * fVar243 + fVar237 * fVar88;
    fVar241 = (fVar217 * fVar245 + fVar250 * fVar239) * fVar245 + fVar239 * fVar89;
    fVar244 = (fVar217 * fVar251 + fVar250 * fVar240) * fVar251 + fVar240 * fVar145;
    fVar250 = (fVar217 * fVar253 + fVar250 * fVar242) * fVar253 + fVar242 * fVar162;
    fVar235 = (fVar224 * fVar243 + fVar252 * fVar237) * fVar243 + fVar237 * fVar174;
    fVar222 = (fVar224 * fVar245 + fVar252 * fVar239) * fVar245 + fVar239 * fVar206;
    fVar223 = (fVar224 * fVar251 + fVar252 * fVar240) * fVar251 + fVar240 * fVar215;
    fVar224 = (fVar224 * fVar253 + fVar252 * fVar242) * fVar253 + fVar242 * fVar226;
    fVar88 = fVar88 * fVar243 + (fVar254 * fVar243 + fVar255 * fVar237) * fVar237;
    fVar89 = fVar89 * fVar245 + (fVar254 * fVar245 + fVar255 * fVar239) * fVar239;
    fVar145 = fVar145 * fVar251 + (fVar254 * fVar251 + fVar255 * fVar240) * fVar240;
    fVar162 = fVar162 * fVar253 + (fVar254 * fVar253 + fVar255 * fVar242) * fVar242;
    fVar252 = fVar174 * fVar243 + (fVar236 * fVar243 + fVar256 * fVar237) * fVar237;
    fVar254 = fVar206 * fVar245 + (fVar236 * fVar245 + fVar256 * fVar239) * fVar239;
    fVar225 = fVar215 * fVar251 + (fVar236 * fVar251 + fVar256 * fVar240) * fVar240;
    fVar226 = fVar226 * fVar253 + (fVar236 * fVar253 + fVar256 * fVar242) * fVar242;
    fVar174 = fVar243 * fVar238 + fVar237 * fVar88;
    fVar206 = fVar245 * fVar241 + fVar239 * fVar89;
    fVar215 = fVar251 * fVar244 + fVar240 * fVar145;
    fVar217 = fVar253 * fVar250 + fVar242 * fVar162;
    fVar236 = fVar243 * fVar235 + fVar237 * fVar252;
    fVar237 = fVar245 * fVar222 + fVar239 * fVar254;
    fVar239 = fVar251 * fVar223 + fVar240 * fVar225;
    fVar240 = fVar253 * fVar224 + fVar242 * fVar226;
    fVar89 = (fVar89 - fVar241) * 3.0 * fVar54;
    fVar145 = (fVar145 - fVar244) * 3.0 * fVar54;
    fVar162 = (fVar162 - fVar250) * 3.0 * fVar54;
    fVar241 = (fVar254 - fVar222) * 3.0 * fVar54;
    fVar244 = (fVar225 - fVar223) * 3.0 * fVar54;
    fVar250 = (fVar226 - fVar224) * 3.0 * fVar54;
    local_208._4_4_ = fVar215;
    local_208._0_4_ = fVar206;
    local_208._8_4_ = fVar217;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar239;
    local_228._0_4_ = fVar237;
    local_228._8_4_ = fVar240;
    local_228._12_4_ = 0;
    fVar88 = fVar174 + (fVar88 - fVar238) * 3.0 * fVar54;
    fVar222 = fVar206 + fVar89;
    fVar223 = fVar215 + fVar145;
    fVar224 = fVar217 + fVar162;
    local_218 = fVar236 + (fVar252 - fVar235) * 3.0 * fVar54;
    fStack_214 = fVar237 + fVar241;
    fStack_210 = fVar239 + fVar244;
    fStack_20c = fVar240 + fVar250;
    local_248._0_4_ = fVar206 - fVar89;
    local_248._4_4_ = fVar215 - fVar145;
    local_248._8_4_ = fVar217 - fVar162;
    local_248._12_4_ = 0;
    local_238._0_4_ = fVar237 - fVar241;
    local_238._4_4_ = fVar239 - fVar244;
    local_238._8_4_ = fVar240 - fVar250;
    local_238._12_4_ = 0;
    local_1f8._8_4_ = fStack_3dc;
    local_1f8._12_4_ = 0;
    fVar235 = (fVar206 - fStack_3e4) + (fVar174 - local_3e8);
    fVar238 = (fVar215 - fStack_3e0) + (fVar206 - fStack_3e4);
    fVar241 = (fVar217 - fStack_3dc) + (fVar215 - fStack_3e0);
    fVar244 = (fVar217 - fStack_3dc) + 0.0;
    fVar54 = (fVar237 - fStack_3d4) + (fVar236 - local_3d8);
    fVar89 = (fVar239 - fStack_3d0) + (fVar237 - fStack_3d4);
    fVar145 = (fVar240 - fStack_3cc) + (fVar239 - fStack_3d0);
    fVar162 = (fVar240 - fStack_3cc) + 0.0;
    auVar154._0_8_ =
         CONCAT44(fStack_3d4 * fVar238 - fStack_3e4 * fVar89,
                  local_3d8 * fVar235 - local_3e8 * fVar54);
    auVar154._8_4_ = fStack_3d0 * fVar241 - fStack_3e0 * fVar145;
    auVar154._12_4_ = fStack_3cc * fVar244 - fStack_3dc * fVar162;
    auVar115._0_4_ = fVar55 * fVar235 - fVar173 * fVar54;
    auVar115._4_4_ = fVar87 * fVar238 - fVar207 * fVar89;
    auVar115._8_4_ = fStack_510 * fVar241 - fVar208 * fVar145;
    auVar115._12_4_ = fStack_50c * fVar244 - fVar216 * fVar162;
    auVar127._0_8_ =
         CONCAT44(local_1e8._4_4_ * fVar238 - fVar89 * local_3c8._4_4_,
                  local_1e8._0_4_ * fVar235 - fVar54 * local_3c8._0_4_);
    auVar127._8_4_ = local_1e8._8_4_ * fVar241 - fVar145 * local_3c8._8_4_;
    auVar127._12_4_ = fVar244 * 0.0 - fVar162 * 0.0;
    auVar268._0_4_ = fVar235 * fStack_3d4 - fVar54 * fStack_3e4;
    auVar268._4_4_ = fVar238 * fStack_3d0 - fVar89 * fStack_3e0;
    auVar268._8_4_ = fVar241 * fStack_3cc - fVar145 * fStack_3dc;
    auVar268._12_4_ = fVar244 * 0.0 - fVar162 * 0.0;
    auVar80._0_8_ =
         CONCAT44(fVar237 * fVar238 - fVar206 * fVar89,fVar236 * fVar235 - fVar174 * fVar54);
    auVar80._8_4_ = fVar239 * fVar241 - fVar215 * fVar145;
    auVar80._12_4_ = fVar240 * fVar244 - fVar217 * fVar162;
    auVar232._0_4_ = local_218 * fVar235 - fVar88 * fVar54;
    auVar232._4_4_ = fStack_214 * fVar238 - fVar222 * fVar89;
    auVar232._8_4_ = fStack_210 * fVar241 - fVar223 * fVar145;
    auVar232._12_4_ = fStack_20c * fVar244 - fVar224 * fVar162;
    auVar197._0_8_ =
         CONCAT44(local_238._4_4_ * fVar238 - fVar89 * local_248._4_4_,
                  local_238._0_4_ * fVar235 - fVar54 * local_248._0_4_);
    auVar197._8_4_ = local_238._8_4_ * fVar241 - fVar145 * local_248._8_4_;
    auVar197._12_4_ = fVar244 * 0.0 - fVar162 * 0.0;
    auVar218._0_4_ = fVar235 * fVar237 - fVar54 * fVar206;
    auVar218._4_4_ = fVar238 * fVar239 - fVar89 * fVar215;
    auVar218._8_4_ = fVar241 * fVar240 - fVar145 * fVar217;
    auVar218._12_4_ = fVar244 * 0.0 - fVar162 * 0.0;
    auVar263._8_4_ = auVar154._8_4_;
    auVar263._0_8_ = auVar154._0_8_;
    auVar263._12_4_ = auVar154._12_4_;
    auVar153 = minps(auVar263,auVar115);
    auVar152 = maxps(auVar154,auVar115);
    auVar116._8_4_ = auVar127._8_4_;
    auVar116._0_8_ = auVar127._0_8_;
    auVar116._12_4_ = auVar127._12_4_;
    auVar63 = minps(auVar116,auVar268);
    auVar264 = minps(auVar153,auVar63);
    auVar63 = maxps(auVar127,auVar268);
    auVar110 = maxps(auVar152,auVar63);
    auVar117._8_4_ = auVar80._8_4_;
    auVar117._0_8_ = auVar80._0_8_;
    auVar117._12_4_ = auVar80._12_4_;
    auVar152 = minps(auVar117,auVar232);
    auVar63 = maxps(auVar80,auVar232);
    auVar128._8_4_ = auVar197._8_4_;
    auVar128._0_8_ = auVar197._0_8_;
    auVar128._12_4_ = auVar197._12_4_;
    auVar153 = minps(auVar128,auVar218);
    auVar152 = minps(auVar152,auVar153);
    auVar153 = minps(auVar264,auVar152);
    auVar152 = maxps(auVar197,auVar218);
    auVar63 = maxps(auVar63,auVar152);
    auVar63 = maxps(auVar110,auVar63);
    auVar155._0_4_ =
         -(uint)(local_268 <= auVar63._0_4_ && auVar153._0_4_ <= local_258) & local_278._0_4_;
    auVar155._4_4_ =
         -(uint)(fStack_264 <= auVar63._4_4_ && auVar153._4_4_ <= fStack_254) & local_278._4_4_;
    auVar155._8_4_ =
         -(uint)(fStack_260 <= auVar63._8_4_ && auVar153._8_4_ <= fStack_250) & local_278._8_4_;
    auVar155._12_4_ =
         -(uint)(fStack_25c <= auVar63._12_4_ && auVar153._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar42 = movmskps((int)uVar44,auVar155);
    uVar38 = 0;
    if (iVar42 != 0) {
      fVar235 = (fVar206 - fVar174) + (fStack_3e4 - local_3e8);
      fVar238 = (fVar215 - fVar206) + (fStack_3e0 - fStack_3e4);
      fVar241 = (fVar217 - fVar215) + (fStack_3dc - fStack_3e0);
      fVar244 = (0.0 - fVar217) + (0.0 - fStack_3dc);
      fVar54 = (fVar237 - fVar236) + (fStack_3d4 - local_3d8);
      fVar89 = (fVar239 - fVar237) + (fStack_3d0 - fStack_3d4);
      fVar145 = (fVar240 - fVar239) + (fStack_3cc - fStack_3d0);
      fVar162 = (0.0 - fVar240) + (0.0 - fStack_3cc);
      auVar269._0_8_ =
           CONCAT44(fStack_3d4 * fVar238 - fStack_3e4 * fVar89,
                    local_3d8 * fVar235 - local_3e8 * fVar54);
      auVar269._8_4_ = fStack_3d0 * fVar241 - fStack_3e0 * fVar145;
      auVar269._12_4_ = fStack_3cc * fVar244 - fStack_3dc * fVar162;
      auVar118._0_4_ = fVar55 * fVar235 - fVar173 * fVar54;
      auVar118._4_4_ = fVar87 * fVar238 - fVar207 * fVar89;
      auVar118._8_4_ = fStack_510 * fVar241 - fVar208 * fVar145;
      auVar118._12_4_ = fStack_50c * fVar244 - fVar216 * fVar162;
      auVar190._0_8_ =
           CONCAT44(local_1e8._4_4_ * fVar238 - local_3c8._4_4_ * fVar89,
                    local_1e8._0_4_ * fVar235 - local_3c8._0_4_ * fVar54);
      auVar190._8_4_ = local_1e8._8_4_ * fVar241 - local_3c8._8_4_ * fVar145;
      auVar190._12_4_ = fVar244 * 0.0 - fVar162 * 0.0;
      auVar129._0_4_ = fStack_3d4 * fVar235 - fStack_3e4 * fVar54;
      auVar129._4_4_ = fStack_3d0 * fVar238 - fStack_3e0 * fVar89;
      auVar129._8_4_ = fStack_3cc * fVar241 - fStack_3dc * fVar145;
      auVar129._12_4_ = fVar244 * 0.0 - fVar162 * 0.0;
      auVar257._0_8_ =
           CONCAT44(fVar237 * fVar238 - fVar206 * fVar89,fVar236 * fVar235 - fVar174 * fVar54);
      auVar257._8_4_ = fVar239 * fVar241 - fVar215 * fVar145;
      auVar257._12_4_ = fVar240 * fVar244 - fVar217 * fVar162;
      auVar142._0_4_ = local_218 * fVar235 - fVar88 * fVar54;
      auVar142._4_4_ = fStack_214 * fVar238 - fVar222 * fVar89;
      auVar142._8_4_ = fStack_210 * fVar241 - fVar223 * fVar145;
      auVar142._12_4_ = fStack_20c * fVar244 - fVar224 * fVar162;
      auVar233._0_8_ =
           CONCAT44(local_238._4_4_ * fVar238 - local_248._4_4_ * fVar89,
                    local_238._0_4_ * fVar235 - local_248._0_4_ * fVar54);
      auVar233._8_4_ = local_238._8_4_ * fVar241 - local_248._8_4_ * fVar145;
      auVar233._12_4_ = fVar244 * 0.0 - fVar162 * 0.0;
      auVar219._0_4_ = fVar235 * fVar237 - fVar54 * fVar206;
      auVar219._4_4_ = fVar238 * fVar239 - fVar89 * fVar215;
      auVar219._8_4_ = fVar241 * fVar240 - fVar145 * fVar217;
      auVar219._12_4_ = fVar244 * 0.0 - fVar162 * 0.0;
      auVar81._8_4_ = auVar269._8_4_;
      auVar81._0_8_ = auVar269._0_8_;
      auVar81._12_4_ = auVar269._12_4_;
      auVar63 = minps(auVar81,auVar118);
      auVar153 = maxps(auVar269,auVar118);
      auVar119._8_4_ = auVar190._8_4_;
      auVar119._0_8_ = auVar190._0_8_;
      auVar119._12_4_ = auVar190._12_4_;
      auVar152 = minps(auVar119,auVar129);
      auVar63 = minps(auVar63,auVar152);
      auVar152 = maxps(auVar190,auVar129);
      auVar264 = maxps(auVar153,auVar152);
      auVar120._8_4_ = auVar257._8_4_;
      auVar120._0_8_ = auVar257._0_8_;
      auVar120._12_4_ = auVar257._12_4_;
      auVar152 = minps(auVar120,auVar142);
      auVar110 = maxps(auVar257,auVar142);
      auVar130._8_4_ = auVar233._8_4_;
      auVar130._0_8_ = auVar233._0_8_;
      auVar130._12_4_ = auVar233._12_4_;
      auVar153 = minps(auVar130,auVar219);
      auVar152 = minps(auVar152,auVar153);
      auVar63 = minps(auVar63,auVar152);
      auVar152 = maxps(auVar233,auVar219);
      auVar152 = maxps(auVar110,auVar152);
      auVar152 = maxps(auVar264,auVar152);
      auVar270._0_4_ =
           -(uint)(local_268 <= auVar152._0_4_ && auVar63._0_4_ <= local_258) & auVar155._0_4_;
      auVar270._4_4_ =
           -(uint)(fStack_264 <= auVar152._4_4_ && auVar63._4_4_ <= fStack_254) & auVar155._4_4_;
      auVar270._8_4_ =
           -(uint)(fStack_260 <= auVar152._8_4_ && auVar63._8_4_ <= fStack_250) & auVar155._8_4_;
      auVar270._12_4_ =
           -(uint)(fStack_25c <= auVar152._12_4_ && auVar63._12_4_ <= fStack_24c) & auVar155._12_4_;
      uVar49 = movmskps(0,auVar270);
      uVar38 = (ulong)uVar49;
    }
    if ((uint)uVar38 != 0) {
      auStack_338[uVar46] = (uint)uVar38;
      *(undefined8 *)(afStack_108 + uVar46 * 2) = local_4d8;
      auStack_58[uVar46] = (ulong)local_528;
      uVar46 = (ulong)((int)uVar46 + 1);
    }
    do {
      if ((int)uVar46 == 0) {
        if (local_52c != 0) {
          return local_52d;
        }
        fVar124 = *(float *)(ray + k * 4 + 0x80);
        auVar103._4_4_ = -(uint)(fStack_294 <= fVar124);
        auVar103._0_4_ = -(uint)(local_298 <= fVar124);
        auVar103._8_4_ = -(uint)(fStack_290 <= fVar124);
        auVar103._12_4_ = -(uint)(fStack_28c <= fVar124);
        uVar49 = movmskps((int)uVar38,auVar103);
        uVar48 = uVar48 & (uint)local_440 & uVar49;
        local_52d = uVar48 != 0;
        if (!local_52d) {
          return local_52d;
        }
        goto LAB_00b52bd4;
      }
      uVar51 = (int)uVar46 - 1;
      uVar39 = (ulong)uVar51;
      uVar49 = auStack_338[uVar39];
      local_528 = (undefined1  [8])auStack_58[uVar39];
      uVar38 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
        }
      }
      uVar49 = uVar49 - 1 & uVar49;
      auStack_338[uVar39] = uVar49;
      if (uVar49 == 0) {
        uVar46 = (ulong)uVar51;
      }
      uVar43 = uVar38 + 1;
      uVar44 = uVar43;
      if ((long)uVar43 < 0) {
        uVar44 = (ulong)((uint)uVar43 & 1) | uVar43 >> 1;
      }
      fVar54 = afStack_108[uVar39 * 2];
      fVar55 = afStack_108[uVar39 * 2 + 1];
      fVar87 = fVar54 * (1.0 - (float)uVar38 * 0.33333334) + fVar55 * (float)uVar38 * 0.33333334;
      fVar88 = fVar54 * (1.0 - (float)uVar43 * 0.33333334) + fVar55 * (float)uVar43 * 0.33333334;
      fVar89 = fVar54 * 0.0 + fVar55 * 0.0;
      fVar55 = fVar54 * 0.0 + fVar55 * 0.0;
      fVar54 = fVar88 - fVar87;
      _fStack_520 = 0;
      local_4d8 = CONCAT44(fVar88,fVar87);
      if (0.16666667 <= fVar54) break;
      fVar238 = SUB84(local_528,0);
      fVar244 = (float)((ulong)local_528 >> 0x20);
      fVar145 = 1.0 - fVar238;
      fVar162 = 1.0 - fVar238;
      fVar173 = 1.0 - fVar244;
      fVar174 = 1.0 - fVar244;
      fVar222 = local_4e8 * fVar145 + local_378 * fVar238;
      fVar223 = fStack_4e4 * fVar162 + fStack_374 * fVar238;
      fVar224 = fVar104 * fVar173 + fStack_370 * fVar244;
      fVar235 = fVar123 * fVar174 + fStack_36c * fVar244;
      fVar225 = (float)local_348 * fVar145 + (float)local_388 * fVar238;
      fVar226 = local_348._4_4_ * fVar162 + local_388._4_4_ * fVar238;
      fVar236 = (float)uStack_340 * fVar173 + (float)uStack_380 * fVar244;
      fVar237 = uStack_340._4_4_ * fVar174 + uStack_380._4_4_ * fVar244;
      fVar239 = (float)local_358 * fVar145 + local_398 * fVar238;
      fVar242 = local_358._4_4_ * fVar162 + fStack_394 * fVar238;
      fVar245 = (float)uStack_350 * fVar173 + fStack_390 * fVar244;
      fVar253 = uStack_350._4_4_ * fVar174 + fStack_38c * fVar244;
      fVar241 = (fVar145 * (float)local_368 + fVar238 * (float)local_3a8) - fVar239;
      fVar250 = (fVar162 * local_368._4_4_ + fVar238 * local_3a8._4_4_) - fVar242;
      fVar252 = (fVar173 * (float)uStack_360 + fVar244 * (float)uStack_3a0) - fVar245;
      fVar254 = (fVar174 * uStack_360._4_4_ + fVar244 * uStack_3a0._4_4_) - fVar253;
      fVar145 = fVar87 * (fVar239 - fVar225) + fVar225;
      fVar162 = fVar87 * (fVar242 - fVar226) + fVar226;
      fVar173 = fVar87 * (fVar245 - fVar236) + fVar236;
      fVar174 = fVar87 * (fVar253 - fVar237) + fVar237;
      fVar240 = (fVar239 - fVar225) * fVar88 + fVar225;
      fVar243 = (fVar242 - fVar226) * fVar88 + fVar226;
      fVar251 = (fVar245 - fVar236) * fVar88 + fVar236;
      fVar255 = (fVar253 - fVar237) * fVar88 + fVar237;
      fVar206 = fVar87 * (fVar225 - fVar222) + fVar222;
      fVar207 = fVar87 * (fVar226 - fVar223) + fVar223;
      fVar215 = fVar87 * (fVar236 - fVar224) + fVar224;
      fVar217 = fVar87 * (fVar237 - fVar235) + fVar235;
      fVar206 = (fVar145 - fVar206) * fVar87 + fVar206;
      fVar207 = (fVar162 - fVar207) * fVar87 + fVar207;
      fVar215 = (fVar173 - fVar215) * fVar87 + fVar215;
      fVar217 = (fVar174 - fVar217) * fVar87 + fVar217;
      fVar145 = (((fVar87 * fVar241 + fVar239) - fVar145) * fVar87 + fVar145) - fVar206;
      fVar162 = (((fVar87 * fVar250 + fVar242) - fVar162) * fVar87 + fVar162) - fVar207;
      fVar173 = (((fVar87 * fVar252 + fVar245) - fVar173) * fVar87 + fVar173) - fVar215;
      fVar174 = (((fVar87 * fVar254 + fVar253) - fVar174) * fVar87 + fVar174) - fVar217;
      fVar206 = fVar87 * fVar145 + fVar206;
      fVar207 = fVar87 * fVar162 + fVar207;
      fVar215 = fVar87 * fVar173 + fVar215;
      fVar217 = fVar87 * fVar174 + fVar217;
      fVar222 = (fVar225 - fVar222) * fVar88 + fVar222;
      fVar223 = (fVar226 - fVar223) * fVar88 + fVar223;
      fVar224 = (fVar236 - fVar224) * fVar88 + fVar224;
      fVar235 = (fVar237 - fVar235) * fVar88 + fVar235;
      fVar222 = (fVar240 - fVar222) * fVar88 + fVar222;
      fVar223 = (fVar243 - fVar223) * fVar88 + fVar223;
      fVar224 = (fVar251 - fVar224) * fVar88 + fVar224;
      fVar235 = (fVar255 - fVar235) * fVar88 + fVar235;
      fVar225 = (((fVar241 * fVar88 + fVar239) - fVar240) * fVar88 + fVar240) - fVar222;
      fVar226 = (((fVar250 * fVar88 + fVar242) - fVar243) * fVar88 + fVar243) - fVar223;
      fVar236 = (((fVar252 * fVar88 + fVar245) - fVar251) * fVar88 + fVar251) - fVar224;
      fVar237 = (((fVar254 * fVar88 + fVar253) - fVar255) * fVar88 + fVar255) - fVar235;
      fVar222 = fVar88 * fVar225 + fVar222;
      fVar223 = fVar88 * fVar226 + fVar223;
      fVar224 = fVar88 * fVar236 + fVar224;
      fVar235 = fVar88 * fVar237 + fVar235;
      fVar239 = fVar54 * 0.33333334;
      fVar241 = fVar145 * 3.0 * fVar239 + fVar206;
      fVar250 = fVar162 * 3.0 * fVar239 + fVar207;
      fVar252 = fVar173 * 3.0 * fVar239 + fVar215;
      fVar254 = fVar174 * 3.0 * fVar239 + fVar217;
      fVar225 = fVar222 - fVar239 * fVar225 * 3.0;
      fVar226 = fVar223 - fVar239 * fVar226 * 3.0;
      fVar236 = fVar224 - fVar239 * fVar236 * 3.0;
      fVar237 = fVar235 - fVar239 * fVar237 * 3.0;
      local_508 = (RayQueryContext *)CONCAT44(fVar217,fVar215);
      fVar243 = (fVar224 - fVar222) + (fVar215 - fVar206);
      fVar245 = (fVar235 - fVar223) + (fVar217 - fVar207);
      auVar198._0_4_ = fVar245 * fVar223;
      auVar198._4_4_ = fVar245 * fVar223;
      auVar198._8_4_ = fVar245 * fVar235;
      auVar198._12_4_ = fVar245 * fVar235;
      fVar145 = fVar206 * fVar243 + fVar207 * fVar245;
      fVar162 = fVar215 * fVar243 + fVar217 * fVar245;
      fVar251 = fVar241 * fVar243 + fVar250 * fVar245;
      fVar253 = fVar252 * fVar243 + fVar254 * fVar245;
      fVar239 = fVar225 * fVar243 + fVar226 * fVar245;
      auVar209._4_4_ = fVar226 * fVar243 + fVar226 * fVar245;
      auVar209._0_4_ = fVar239;
      fVar240 = fVar236 * fVar243 + fVar237 * fVar245;
      fVar173 = fVar243 * fVar222 + auVar198._0_4_;
      fVar242 = fVar243 * fVar224 + auVar198._8_4_;
      auVar13._4_8_ = auVar198._8_8_;
      auVar13._0_4_ = fVar250 * fVar243 + fVar250 * fVar245;
      auVar199._0_8_ = auVar13._0_8_ << 0x20;
      auVar199._8_4_ = fVar253;
      auVar199._12_4_ = fVar254 * fVar243 + fVar254 * fVar245;
      fVar174 = fVar251;
      if (fVar251 <= fVar145) {
        fVar174 = fVar145;
        fVar145 = fVar251;
      }
      auVar200._8_8_ = auVar199._8_8_;
      auVar200._0_8_ = auVar200._8_8_;
      auVar209._8_4_ = fVar240;
      auVar209._12_4_ = fVar237 * fVar243 + fVar237 * fVar245;
      if (fVar173 <= fVar239) {
        auVar209._0_4_ = fVar173;
      }
      if (auVar209._0_4_ <= fVar145) {
        fVar145 = auVar209._0_4_;
      }
      auVar14._4_8_ = auVar209._8_8_;
      auVar14._0_4_ = fVar243 * fVar223 + auVar198._4_4_;
      auVar210._0_8_ = auVar14._0_8_ << 0x20;
      auVar210._8_4_ = fVar242;
      auVar210._12_4_ = fVar243 * fVar235 + auVar198._12_4_;
      if (fVar173 <= fVar239) {
        fVar173 = fVar239;
      }
      auVar211._8_8_ = auVar210._8_8_;
      auVar211._0_8_ = auVar211._8_8_;
      if (fVar173 <= fVar174) {
        fVar173 = fVar174;
      }
      if (fVar253 <= fVar162) {
        auVar200._0_4_ = fVar162;
        fVar162 = fVar253;
      }
      fVar174 = fVar240;
      if (fVar242 <= fVar240) {
        fVar174 = fVar242;
      }
      if (fVar174 <= fVar162) {
        fVar162 = fVar174;
      }
      if (fVar242 <= fVar240) {
        auVar211._0_4_ = fVar240;
      }
      if (auVar211._0_4_ <= auVar200._0_4_) {
        auVar211._0_4_ = auVar200._0_4_;
      }
      uVar44 = CONCAT71((int7)(uVar44 >> 8),fVar54 < 0.001);
      bVar47 = 3 < (uint)uVar46;
      uVar15 = (undefined3)(uVar51 >> 8);
      uVar38 = (ulong)CONCAT31(uVar15,bVar47);
      fVar174 = auVar211._0_4_;
      if ((0.0001 <= fVar145) || (fVar174 <= -0.0001)) {
        if ((-0.0001 < fVar173 && fVar162 < 0.0001) ||
           ((fVar145 < 0.0001 && -0.0001 < fVar173 || (fVar162 < 0.0001 && -0.0001 < fVar174))))
        goto LAB_00b53e67;
        bVar18 = true;
      }
      else {
LAB_00b53e67:
        bVar47 = bVar47 || fVar54 < 0.001;
        uVar38 = (ulong)CONCAT31(uVar15,bVar47);
        fVar242 = (float)(~-(uint)(fVar145 < 0.0) & 0x3f800000 | -(uint)(fVar145 < 0.0) & 0xbf800000
                         );
        fVar240 = (float)(~-(uint)(fVar173 < 0.0) & 0x3f800000 | -(uint)(fVar173 < 0.0) & 0xbf800000
                         );
        fVar239 = 0.0;
        if ((fVar242 == fVar240) && (!NAN(fVar242) && !NAN(fVar240))) {
          fVar239 = INFINITY;
        }
        fVar243 = 0.0;
        if ((fVar242 == fVar240) && (!NAN(fVar242) && !NAN(fVar240))) {
          fVar243 = -INFINITY;
        }
        fVar245 = (float)(~-(uint)(fVar162 < 0.0) & 0x3f800000 | -(uint)(fVar162 < 0.0) & 0xbf800000
                         );
        if ((fVar242 != fVar245) || (fVar251 = fVar243, NAN(fVar242) || NAN(fVar245))) {
          if ((fVar162 != fVar145) || (NAN(fVar162) || NAN(fVar145))) {
            fVar251 = -fVar145 / (fVar162 - fVar145);
            fVar251 = (1.0 - fVar251) * 0.0 + fVar251;
            fVar162 = fVar251;
          }
          else {
            fVar162 = INFINITY;
            if ((fVar145 == 0.0) && (fVar162 = INFINITY, !NAN(fVar145))) {
              fVar162 = 0.0;
            }
            fVar251 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar145 == 0.0) & 1) * 4);
          }
          if (fVar162 <= fVar239) {
            fVar239 = fVar162;
          }
          if (fVar251 <= fVar243) {
            fVar251 = fVar243;
          }
        }
        uVar44 = (ulong)(fVar174 < 0.0);
        fVar145 = *(float *)(&DAT_01ff1ecc + uVar44 * 4);
        if ((fVar240 != fVar145) || (fVar162 = fVar251, NAN(fVar240) || NAN(fVar145))) {
          if ((fVar174 != fVar173) || (NAN(fVar174) || NAN(fVar173))) {
            fVar174 = -fVar173 / (fVar174 - fVar173);
            fVar174 = (1.0 - fVar174) * 0.0 + fVar174;
            fVar162 = fVar174;
          }
          else {
            fVar174 = INFINITY;
            if ((fVar173 == 0.0) && (fVar174 = INFINITY, !NAN(fVar173))) {
              fVar174 = 0.0;
            }
            uVar44 = (ulong)(-(uint)(fVar173 == 0.0) & 1);
            fVar162 = *(float *)(&DAT_01ff1ec4 + uVar44 * 4);
          }
          if (fVar174 <= fVar239) {
            fVar239 = fVar174;
          }
          if (fVar162 <= fVar251) {
            fVar162 = fVar251;
          }
        }
        if ((fVar245 != fVar145) || (NAN(fVar245) || NAN(fVar145))) {
          fVar239 = (float)(~-(uint)(fVar239 < 1.0) & 0x3f800000 |
                           (uint)fVar239 & -(uint)(fVar239 < 1.0));
          fVar162 = (float)(~-(uint)(fVar162 < 1.0) & (uint)fVar162 |
                           -(uint)(fVar162 < 1.0) & 0x3f800000);
        }
        fVar239 = (float)(~-(uint)(fVar239 < 0.0) & (uint)fVar239);
        fVar145 = (float)(~-(uint)(fVar162 < 1.0) & 0x3f800000 |
                         (uint)fVar162 & -(uint)(fVar162 < 1.0));
        bVar18 = true;
        local_4e8 = fVar224;
        fStack_4e4 = fVar235;
        if (fVar239 <= fVar145) {
          fVar239 = fVar239 + -0.1;
          fVar145 = fVar145 + 0.1;
          uVar49 = -(uint)(fVar145 < 1.0);
          fVar239 = (float)(~-(uint)(fVar239 < 0.0) & (uint)fVar239);
          fVar251 = (float)(~uVar49 & 0x3f800000 | (uint)fVar145 & uVar49);
          fVar240 = 1.0 - fVar239;
          fVar242 = 1.0 - fVar239;
          fVar243 = 1.0 - fVar251;
          fVar245 = 1.0 - fVar251;
          fVar145 = fVar206 * fVar240 + fVar215 * fVar239;
          fVar162 = fVar207 * fVar242 + fVar217 * fVar239;
          fVar173 = fVar206 * fVar243 + fStack_510 * fVar251;
          fVar174 = fVar207 * fVar245 + fStack_50c * fVar251;
          fVar206 = fVar241 * fVar240 + fVar252 * fVar239;
          fVar207 = fVar250 * fVar242 + fVar254 * fVar239;
          fVar215 = fVar241 * fVar243 + fVar252 * fVar251;
          fVar217 = fVar250 * fVar245 + fVar254 * fVar251;
          fVar241 = fVar225 * fVar240 + fVar236 * fVar239;
          fVar250 = fVar226 * fVar242 + fVar237 * fVar239;
          fVar252 = fVar225 * fVar243 + fVar236 * fVar251;
          fVar254 = fVar226 * fVar245 + fVar237 * fVar251;
          fVar224 = fVar240 * fVar222 + fVar224 * fVar239;
          fVar235 = fVar242 * fVar223 + fVar235 * fVar239;
          fVar222 = fVar243 * fVar222 + fVar208 * fVar251;
          fVar223 = fVar245 * fVar223 + fVar216 * fVar251;
          local_528._0_4_ = fVar238 * (1.0 - fVar239) + fVar244 * fVar239;
          fStack_50c = fVar238 * (1.0 - fVar251) + fVar244 * fVar251;
          fVar54 = 1.0 / fVar54;
          auVar100._0_4_ = fVar222 - fVar224;
          auVar100._4_4_ = fVar223 - fVar235;
          auVar100._8_4_ = fVar222 - fVar222;
          auVar100._12_4_ = fVar223 - fVar223;
          auVar131._0_8_ = CONCAT44(fVar254 - fVar250,fVar252 - fVar241);
          auVar131._8_4_ = fVar252 - fVar252;
          auVar131._12_4_ = fVar254 - fVar254;
          auVar220._0_4_ = fVar215 - fVar206;
          auVar220._4_4_ = fVar217 - fVar207;
          auVar220._8_4_ = fVar215 - fVar215;
          auVar220._12_4_ = fVar217 - fVar217;
          auVar191._0_8_ = CONCAT44((fVar207 - fVar162) * 3.0,(fVar206 - fVar145) * 3.0);
          auVar191._8_4_ = (fVar215 - fVar173) * 3.0;
          auVar191._12_4_ = (fVar217 - fVar174) * 3.0;
          auVar156._0_8_ = CONCAT44((fVar250 - fVar207) * 3.0,(fVar241 - fVar206) * 3.0);
          auVar156._8_4_ = (fVar252 - fVar215) * 3.0;
          auVar156._12_4_ = (fVar254 - fVar217) * 3.0;
          auVar212._0_4_ = (fVar224 - fVar241) * 3.0;
          auVar212._4_4_ = (fVar235 - fVar250) * 3.0;
          auVar212._8_4_ = (fVar222 - fVar252) * 3.0;
          auVar212._12_4_ = (fVar223 - fVar254) * 3.0;
          auVar165._8_4_ = auVar156._8_4_;
          auVar165._0_8_ = auVar156._0_8_;
          auVar165._12_4_ = auVar156._12_4_;
          auVar152 = minps(auVar165,auVar212);
          auVar63 = maxps(auVar156,auVar212);
          auVar201._8_4_ = auVar191._8_4_;
          auVar201._0_8_ = auVar191._0_8_;
          auVar201._12_4_ = auVar191._12_4_;
          auVar110 = minps(auVar201,auVar152);
          auVar153 = maxps(auVar191,auVar63);
          auVar16._4_8_ = auVar63._8_8_;
          auVar16._0_4_ = auVar110._4_4_;
          auVar157._0_8_ = auVar16._0_8_ << 0x20;
          auVar157._8_4_ = auVar110._8_4_;
          auVar157._12_4_ = auVar110._12_4_;
          auVar158._8_8_ = auVar110._8_8_;
          auVar158._0_8_ = auVar157._8_8_;
          auVar17._4_8_ = auVar152._8_8_;
          auVar17._0_4_ = auVar153._4_4_;
          auVar166._0_8_ = auVar17._0_8_ << 0x20;
          auVar166._8_4_ = auVar153._8_4_;
          auVar166._12_4_ = auVar153._12_4_;
          auVar167._8_8_ = auVar153._8_8_;
          auVar167._0_8_ = auVar166._8_8_;
          auVar152 = minps(auVar110,auVar158);
          auVar63 = maxps(auVar153,auVar167);
          fVar237 = auVar152._0_4_ * fVar54;
          fVar239 = auVar152._4_4_ * fVar54;
          fVar240 = auVar152._8_4_ * fVar54;
          fVar242 = auVar152._12_4_ * fVar54;
          fVar235 = fVar54 * auVar63._0_4_;
          fVar241 = fVar54 * auVar63._4_4_;
          fVar250 = fVar54 * auVar63._8_4_;
          fVar54 = fVar54 * auVar63._12_4_;
          fVar226 = 1.0 / (fStack_50c - (float)local_528._0_4_);
          auVar121._0_8_ = CONCAT44(fVar174 - fVar162,fVar173 - fVar145);
          auVar121._8_4_ = fVar173 - fVar173;
          auVar121._12_4_ = fVar174 - fVar174;
          auVar168._8_4_ = auVar121._8_4_;
          auVar168._0_8_ = auVar121._0_8_;
          auVar168._12_4_ = auVar121._12_4_;
          auVar153 = minps(auVar168,auVar220);
          auVar152 = maxps(auVar121,auVar220);
          auVar82._8_4_ = auVar131._8_4_;
          auVar82._0_8_ = auVar131._0_8_;
          auVar82._12_4_ = auVar131._12_4_;
          auVar63 = minps(auVar82,auVar100);
          auVar153 = minps(auVar153,auVar63);
          auVar63 = maxps(auVar131,auVar100);
          auVar63 = maxps(auVar152,auVar63);
          fVar254 = auVar153._0_4_ * fVar226;
          fVar225 = auVar153._4_4_ * fVar226;
          fVar236 = fVar226 * auVar63._0_4_;
          fVar226 = fVar226 * auVar63._4_4_;
          local_528._4_4_ = fStack_50c;
          fStack_520 = fVar238 * 0.0 + fVar244 * 0.0;
          fStack_51c = fVar238 * 0.0 + fVar244 * 0.0;
          auVar159._4_4_ = fStack_50c;
          auVar159._0_4_ = fVar88;
          auVar159._8_4_ = fVar89;
          auVar159._12_4_ = fVar55;
          local_b8 = (fVar87 + fVar88) * 0.5;
          fVar145 = ((float)local_528._0_4_ + fStack_50c) * 0.5;
          fVar162 = (fVar88 + fVar89) * 0.0;
          fVar173 = (fStack_50c + fVar55) * 0.0;
          fVar174 = local_118 * local_b8 + fVar104;
          fVar206 = fStack_114 * local_b8 + fVar123;
          fVar207 = fStack_110 * local_b8 + fVar137;
          fVar215 = fStack_10c * local_b8 + fVar138;
          fVar217 = local_128 * local_b8 + fVar194;
          fVar222 = fStack_124 * local_b8 + fVar195;
          fVar223 = fStack_120 * local_b8 + fVar161;
          fVar224 = fStack_11c * local_b8 + fVar125;
          fVar174 = (fVar217 - fVar174) * local_b8 + fVar174;
          fVar206 = (fVar222 - fVar206) * local_b8 + fVar206;
          fVar207 = (fVar223 - fVar207) * local_b8 + fVar207;
          fVar215 = (fVar224 - fVar215) * local_b8 + fVar215;
          fVar217 = (((local_138 * local_b8 + fVar175) - fVar217) * local_b8 + fVar217) - fVar174;
          fVar222 = (((fStack_134 * local_b8 + fVar193) - fVar222) * local_b8 + fVar222) - fVar206;
          fVar223 = (((fStack_130 * local_b8 + fVar146) - fVar223) * local_b8 + fVar223) - fVar207;
          fVar224 = (((fStack_12c * local_b8 + fVar160) - fVar224) * local_b8 + fVar224) - fVar215;
          fVar174 = local_b8 * fVar217 + fVar174;
          fVar206 = local_b8 * fVar222 + fVar206;
          fVar217 = fVar217 * 3.0;
          fVar222 = fVar222 * 3.0;
          fVar207 = (local_b8 * fVar223 + fVar207) - fVar174;
          fVar215 = (local_b8 * fVar224 + fVar215) - fVar206;
          fVar217 = (fVar223 * 3.0 - fVar217) * fVar145 + fVar217;
          fVar222 = (fVar224 * 3.0 - fVar222) * fVar145 + fVar222;
          auVar101._0_8_ = CONCAT44(fVar217,fVar207) ^ 0x80000000;
          auVar101._8_4_ = fVar217;
          auVar101._12_4_ = fVar217;
          fVar243 = fVar87 - local_b8;
          fVar245 = (float)local_528._0_4_ - fVar145;
          fVar251 = fVar88 - fVar162;
          fVar253 = fStack_50c - fVar173;
          fVar255 = fVar88 - local_b8;
          fVar256 = fStack_50c - fVar145;
          fVar89 = fVar89 - fVar162;
          fVar55 = fVar55 - fVar173;
          fVar174 = fVar207 * fVar145 + fVar174;
          fVar206 = fVar215 * fVar145 + fVar206;
          auVar122._0_8_ = CONCAT44(fVar222,fVar215) ^ 0x8000000000000000;
          auVar122._8_4_ = -fVar222;
          auVar122._12_4_ = -fVar222;
          auVar247._0_4_ = fVar215 * fVar217 - fVar222 * fVar207;
          auVar247._4_4_ = auVar247._0_4_;
          auVar247._8_4_ = auVar247._0_4_;
          auVar247._12_4_ = auVar247._0_4_;
          auVar152 = divps(auVar122,auVar247);
          auVar63 = divps(auVar101,auVar247);
          fVar215 = auVar152._0_4_;
          fVar217 = auVar152._4_4_;
          fVar173 = auVar63._0_4_;
          fVar207 = auVar63._4_4_;
          local_b8 = local_b8 - (fVar206 * fVar173 + fVar174 * fVar215);
          local_a8 = fVar145 - (fVar206 * fVar207 + fVar174 * fVar217);
          fVar162 = fVar145 - (fVar206 * auVar63._8_4_ + fVar174 * auVar152._8_4_);
          fVar145 = fVar145 - (fVar206 * auVar63._12_4_ + fVar174 * auVar152._12_4_);
          auVar265._0_8_ = CONCAT44(fVar217 * fVar254,fVar217 * fVar237);
          auVar265._8_4_ = fVar217 * fVar239;
          auVar265._12_4_ = fVar217 * fVar225;
          auVar213._0_4_ = fVar217 * fVar235;
          auVar213._4_4_ = fVar217 * fVar236;
          auVar213._8_4_ = fVar217 * fVar241;
          auVar213._12_4_ = fVar217 * fVar226;
          auVar271._8_4_ = auVar265._8_4_;
          auVar271._0_8_ = auVar265._0_8_;
          auVar271._12_4_ = auVar265._12_4_;
          auVar110 = minps(auVar271,auVar213);
          auVar152 = maxps(auVar213,auVar265);
          auVar132._0_8_ = CONCAT44(fVar207 * fVar225,fVar207 * fVar239);
          auVar132._8_4_ = fVar207 * fVar240;
          auVar132._12_4_ = fVar207 * fVar242;
          auVar266._0_4_ = fVar207 * fVar241;
          auVar266._4_4_ = fVar207 * fVar226;
          auVar266._8_4_ = fVar207 * fVar250;
          auVar266._12_4_ = fVar207 * fVar54;
          auVar202._8_4_ = auVar132._8_4_;
          auVar202._0_8_ = auVar132._0_8_;
          auVar202._12_4_ = auVar132._12_4_;
          auVar63 = minps(auVar202,auVar266);
          auVar153 = maxps(auVar266,auVar132);
          fVar174 = 0.0 - (auVar153._0_4_ + auVar152._0_4_);
          fVar206 = 1.0 - (auVar153._4_4_ + auVar152._4_4_);
          fVar222 = 0.0 - (auVar153._8_4_ + auVar152._8_4_);
          fVar223 = 0.0 - (auVar153._12_4_ + auVar152._12_4_);
          fVar224 = 0.0 - (auVar63._0_4_ + auVar110._0_4_);
          fVar238 = 1.0 - (auVar63._4_4_ + auVar110._4_4_);
          fVar244 = 0.0 - (auVar63._8_4_ + auVar110._8_4_);
          fVar252 = 0.0 - (auVar63._12_4_ + auVar110._12_4_);
          auVar214._0_8_ = CONCAT44(fVar245 * fVar206,fVar243 * fVar174);
          auVar214._8_4_ = fVar251 * fVar222;
          auVar214._12_4_ = fVar253 * fVar223;
          auVar248._0_8_ = CONCAT44(fVar254 * fVar215,fVar237 * fVar215);
          auVar248._8_4_ = fVar239 * fVar215;
          auVar248._12_4_ = fVar225 * fVar215;
          auVar203._0_4_ = fVar215 * fVar235;
          auVar203._4_4_ = fVar215 * fVar236;
          auVar203._8_4_ = fVar215 * fVar241;
          auVar203._12_4_ = fVar215 * fVar226;
          auVar258._8_4_ = auVar248._8_4_;
          auVar258._0_8_ = auVar248._0_8_;
          auVar258._12_4_ = auVar248._12_4_;
          auVar152 = minps(auVar258,auVar203);
          auVar63 = maxps(auVar203,auVar248);
          auVar169._0_8_ = CONCAT44(fVar225 * fVar173,fVar239 * fVar173);
          auVar169._8_4_ = fVar240 * fVar173;
          auVar169._12_4_ = fVar242 * fVar173;
          auVar267._0_4_ = fVar173 * fVar241;
          auVar267._4_4_ = fVar173 * fVar226;
          auVar267._8_4_ = fVar173 * fVar250;
          auVar267._12_4_ = fVar173 * fVar54;
          auVar272._8_4_ = auVar169._8_4_;
          auVar272._0_8_ = auVar169._0_8_;
          auVar272._12_4_ = auVar169._12_4_;
          auVar110 = minps(auVar272,auVar267);
          auVar249._0_4_ = fVar243 * fVar224;
          auVar249._4_4_ = fVar245 * fVar238;
          auVar249._8_4_ = fVar251 * fVar244;
          auVar249._12_4_ = fVar253 * fVar252;
          auVar133._0_8_ = CONCAT44(fVar206 * fVar256,fVar174 * fVar255);
          auVar133._8_4_ = fVar222 * fVar89;
          auVar133._12_4_ = fVar223 * fVar55;
          auVar143._0_4_ = fVar224 * fVar255;
          auVar143._4_4_ = fVar238 * fVar256;
          auVar143._8_4_ = fVar244 * fVar89;
          auVar143._12_4_ = fVar252 * fVar55;
          auVar153 = maxps(auVar267,auVar169);
          fVar54 = 1.0 - (auVar153._0_4_ + auVar63._0_4_);
          fVar174 = 0.0 - (auVar153._4_4_ + auVar63._4_4_);
          fVar206 = 0.0 - (auVar153._8_4_ + auVar63._8_4_);
          fVar222 = 0.0 - (auVar153._12_4_ + auVar63._12_4_);
          fVar223 = 1.0 - (auVar110._0_4_ + auVar152._0_4_);
          fVar224 = 0.0 - (auVar110._4_4_ + auVar152._4_4_);
          fVar235 = 0.0 - (auVar110._8_4_ + auVar152._8_4_);
          fVar238 = 0.0 - (auVar110._12_4_ + auVar152._12_4_);
          auVar204._0_8_ = CONCAT44(fVar245 * fVar174,fVar243 * fVar54);
          auVar204._8_4_ = fVar251 * fVar206;
          auVar204._12_4_ = fVar253 * fVar222;
          auVar221._0_4_ = fVar243 * fVar223;
          auVar221._4_4_ = fVar245 * fVar224;
          auVar221._8_4_ = fVar251 * fVar235;
          auVar221._12_4_ = fVar253 * fVar238;
          auVar170._0_8_ = CONCAT44(fVar174 * fVar256,fVar54 * fVar255);
          auVar170._8_4_ = fVar206 * fVar89;
          auVar170._12_4_ = fVar222 * fVar55;
          auVar192._0_4_ = fVar223 * fVar255;
          auVar192._4_4_ = fVar224 * fVar256;
          auVar192._8_4_ = fVar235 * fVar89;
          auVar192._12_4_ = fVar238 * fVar55;
          auVar234._8_4_ = auVar204._8_4_;
          auVar234._0_8_ = auVar204._0_8_;
          auVar234._12_4_ = auVar204._12_4_;
          auVar63 = minps(auVar234,auVar221);
          auVar259._8_4_ = auVar170._8_4_;
          auVar259._0_8_ = auVar170._0_8_;
          auVar259._12_4_ = auVar170._12_4_;
          auVar152 = minps(auVar259,auVar192);
          auVar110 = minps(auVar63,auVar152);
          auVar152 = maxps(auVar221,auVar204);
          auVar63 = maxps(auVar192,auVar170);
          auVar153 = maxps(auVar63,auVar152);
          auVar171._8_4_ = auVar214._8_4_;
          auVar171._0_8_ = auVar214._0_8_;
          auVar171._12_4_ = auVar214._12_4_;
          auVar63 = minps(auVar171,auVar249);
          auVar205._8_4_ = auVar133._8_4_;
          auVar205._0_8_ = auVar133._0_8_;
          auVar205._12_4_ = auVar133._12_4_;
          auVar152 = minps(auVar205,auVar143);
          auVar152 = minps(auVar63,auVar152);
          auVar264 = maxps(auVar249,auVar214);
          auVar63 = maxps(auVar143,auVar133);
          auVar63 = maxps(auVar63,auVar264);
          auVar172._0_4_ = auVar110._4_4_ + auVar110._0_4_ + local_b8;
          auVar172._4_4_ = auVar152._4_4_ + auVar152._0_4_ + local_a8;
          auVar172._8_4_ = auVar110._8_4_ + auVar110._4_4_ + fVar162;
          auVar172._12_4_ = auVar110._12_4_ + auVar152._4_4_ + fVar145;
          fVar54 = auVar153._4_4_ + auVar153._0_4_ + local_b8;
          fVar55 = auVar63._4_4_ + auVar63._0_4_ + local_a8;
          auVar134._4_4_ = fVar55;
          auVar134._0_4_ = fVar54;
          auVar20._4_4_ = local_528._0_4_;
          auVar20._0_4_ = fVar87;
          auVar20._8_4_ = fVar88;
          auVar20._12_4_ = fStack_50c;
          auVar152 = maxps(auVar20,auVar172);
          auVar134._8_4_ = auVar153._8_4_ + auVar153._4_4_ + fVar162;
          auVar134._12_4_ = auVar153._12_4_ + auVar63._4_4_ + fVar145;
          auVar63 = minps(auVar134,auVar159);
          iVar42 = -(uint)(auVar63._0_4_ < auVar152._0_4_);
          iVar50 = -(uint)(auVar63._4_4_ < auVar152._4_4_);
          auVar136._4_4_ = iVar50;
          auVar136._0_4_ = iVar42;
          auVar136._8_4_ = iVar50;
          auVar136._12_4_ = iVar50;
          auVar135._8_8_ = auVar136._8_8_;
          auVar135._4_4_ = iVar42;
          auVar135._0_4_ = iVar42;
          uVar49 = movmskpd((int)uVar44,auVar135);
          uVar44 = (ulong)uVar49;
          fStack_510 = fVar88;
          if (uVar49 == 0) {
            uVar44 = 0;
            if ((fVar87 < auVar172._0_4_) && (fVar54 < fVar88)) {
              iVar42 = -(uint)(fVar55 < fStack_50c);
              uVar44 = (ulong)CONCAT11((char)((uint)iVar42 >> 8),
                                       (byte)iVar42 & (float)local_528._0_4_ < auVar172._4_4_);
            }
            bVar37 = bVar47 | (byte)uVar44;
            uVar38 = (ulong)CONCAT31(uVar15,bVar37);
            if (bVar37 == 1) {
              uVar38 = 200;
              do {
                fVar55 = 1.0 - local_b8;
                fVar89 = local_b8 * local_b8 * local_b8;
                fVar88 = local_b8 * local_b8 * 3.0 * fVar55;
                fVar54 = fVar55 * fVar55 * fVar55;
                fVar145 = local_b8 * 3.0 * fVar55 * fVar55;
                fVar55 = fVar54 * fVar104 +
                         fVar145 * fVar194 + fVar88 * fVar175 + fVar89 * (float)local_3b8._0_4_;
                fVar87 = fVar54 * fVar123 +
                         fVar145 * fVar195 + fVar88 * fVar193 + fVar89 * (float)local_3b8._4_4_;
                fVar55 = ((fVar54 * fVar137 +
                          fVar145 * fVar161 + fVar88 * fVar146 + fVar89 * fStack_3b0) - fVar55) *
                         local_a8 + fVar55;
                fVar87 = ((fVar54 * fVar138 +
                          fVar145 * fVar125 + fVar88 * fVar160 + fVar89 * fStack_3ac) - fVar87) *
                         local_a8 + fVar87;
                local_b8 = local_b8 - (fVar87 * fVar173 + fVar55 * fVar215);
                local_a8 = local_a8 - (fVar87 * fVar207 + fVar55 * fVar217);
                fVar54 = ABS(fVar87);
                if (ABS(fVar87) <= ABS(fVar55)) {
                  fVar54 = ABS(fVar55);
                }
                if (fVar54 < local_148) {
                  if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) && (0.0 <= local_a8)) &&
                     (local_a8 <= 1.0)) {
                    fVar54 = (pLVar45->vx).field_0.m128[2];
                    fVar55 = (pLVar45->vy).field_0.m128[2];
                    fVar87 = (pLVar45->vz).field_0.m128[2];
                    fVar174 = 1.0 - local_a8;
                    fVar173 = 1.0 - local_b8;
                    fVar88 = fVar173 * fVar173 * fVar173;
                    fVar89 = local_b8 * 3.0 * fVar173 * fVar173;
                    fVar162 = local_b8 * local_b8 * local_b8;
                    fVar145 = local_b8 * local_b8 * 3.0 * fVar173;
                    fVar54 = ((fStack_150 * fVar87 + fStack_154 * fVar55 + local_158 * fVar54) *
                              fVar174 +
                             (fStack_190 * fVar87 + fStack_194 * fVar55 + local_198 * fVar54) *
                             local_a8) * fVar88 +
                             ((fStack_160 * fVar87 + fStack_164 * fVar55 + local_168 * fVar54) *
                              fVar174 +
                             (fStack_1a0 * fVar87 + fStack_1a4 * fVar55 + local_1a8 * fVar54) *
                             local_a8) * fVar89 +
                             ((fStack_170 * fVar87 + fStack_174 * fVar55 + local_178 * fVar54) *
                              fVar174 +
                             (fStack_1b0 * fVar87 + fStack_1b4 * fVar55 + local_1b8 * fVar54) *
                             local_a8) * fVar145 +
                             (fVar174 * (fStack_180 * fVar87 +
                                        fStack_184 * fVar55 + local_188 * fVar54) +
                             (fVar87 * fStack_1c0 + fVar55 * fStack_1c4 + fVar54 * local_1c8) *
                             local_a8) * fVar162;
                    if ((fVar124 <= fVar54) &&
                       (fVar55 = *(float *)(ray + k * 4 + 0x80), fVar54 <= fVar55)) {
                      fVar207 = 1.0 - local_a8;
                      fVar215 = 1.0 - local_a8;
                      fVar217 = 1.0 - local_a8;
                      fVar87 = local_418 * fVar207 + local_288 * local_a8;
                      fVar174 = fStack_414 * fVar215 + fStack_284 * local_a8;
                      fVar206 = fStack_410 * fVar217 + fStack_280 * local_a8;
                      fVar222 = local_438 * fVar207 + fVar91 * local_a8;
                      fVar224 = fStack_434 * fVar215 + fVar106 * local_a8;
                      fVar238 = fStack_430 * fVar217 + fVar144 * local_a8;
                      fVar223 = fVar222 - fVar87;
                      fVar235 = fVar224 - fVar174;
                      fVar241 = fVar238 - fVar206;
                      fVar87 = (((fVar87 - (local_408 * fVar207 + local_3f8 * local_a8)) * fVar173 +
                                local_b8 * fVar223) * fVar173 +
                               (fVar223 * fVar173 +
                               ((fVar207 * local_428 + fVar90 * local_a8) - fVar222) * local_b8) *
                               local_b8) * 3.0;
                      fVar174 = (((fVar174 - (fStack_404 * fVar215 + fStack_3f4 * local_a8)) *
                                  fVar173 + local_b8 * fVar235) * fVar173 +
                                (fVar235 * fVar173 +
                                ((fVar215 * fStack_424 + fVar105 * local_a8) - fVar224) * local_b8)
                                * local_b8) * 3.0;
                      fVar173 = (((fVar206 - (fStack_400 * fVar217 + fStack_3f0 * local_a8)) *
                                  fVar173 + local_b8 * fVar241) * fVar173 +
                                (fVar241 * fVar173 +
                                ((fVar217 * fStack_420 + fVar139 * local_a8) - fVar238) * local_b8)
                                * local_b8) * 3.0;
                      pGVar7 = (context->scene->geometries).items[local_448].ptr;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        uVar38 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar38 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar206 = fVar88 * local_2a8 +
                                  fVar89 * local_2b8 + fVar145 * local_2c8 + fVar162 * local_2d8;
                        fVar207 = fVar88 * fStack_2a4 +
                                  fVar89 * fStack_2b4 + fVar145 * fStack_2c4 + fVar162 * fStack_2d4;
                        fVar88 = fVar88 * fStack_2a0 +
                                 fVar89 * fStack_2b0 + fVar145 * fStack_2c0 + fVar162 * fStack_2d0;
                        local_c8 = fVar207 * fVar87 - fVar174 * fVar206;
                        local_e8 = fVar88 * fVar174 - fVar173 * fVar207;
                        local_d8 = fVar206 * fVar173 - fVar87 * fVar88;
                        fStack_e4 = local_e8;
                        fStack_e0 = local_e8;
                        fStack_dc = local_e8;
                        fStack_d4 = local_d8;
                        fStack_d0 = local_d8;
                        fStack_cc = local_d8;
                        fStack_c4 = local_c8;
                        fStack_c0 = local_c8;
                        fStack_bc = local_c8;
                        fStack_b4 = local_b8;
                        fStack_b0 = local_b8;
                        fStack_ac = local_b8;
                        fStack_a4 = local_a8;
                        fStack_a0 = local_a8;
                        fStack_9c = local_a8;
                        local_98 = CONCAT44(uStack_2f4,local_2f8);
                        uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                        local_88 = CONCAT44(uStack_2e4,local_2e8);
                        uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                        local_78 = context->user->instID[0];
                        uStack_74 = local_78;
                        uStack_70 = local_78;
                        uStack_6c = local_78;
                        local_68 = context->user->instPrimID[0];
                        uStack_64 = local_68;
                        uStack_60 = local_68;
                        uStack_5c = local_68;
                        *(float *)(ray + k * 4 + 0x80) = fVar54;
                        local_468 = *local_458;
                        uStack_460 = local_458[1];
                        local_328.valid = (int *)&local_468;
                        local_328.geometryUserPtr = pGVar7->userPtr;
                        local_328.context = context->user;
                        local_328.ray = (RTCRayN *)ray;
                        local_328.hit = (RTCHitN *)&local_e8;
                        local_328.N = 4;
                        p_Var40 = pGVar7->occlusionFilterN;
                        if (p_Var40 != (RTCFilterFunctionN)0x0) {
                          p_Var40 = (RTCFilterFunctionN)(*p_Var40)(&local_328);
                          context = local_508;
                        }
                        auVar83._0_4_ = -(uint)((int)local_468 == 0);
                        auVar83._4_4_ = -(uint)(local_468._4_4_ == 0);
                        auVar83._8_4_ = -(uint)((int)uStack_460 == 0);
                        auVar83._12_4_ = -(uint)(uStack_460._4_4_ == 0);
                        uVar49 = movmskps((int)p_Var40,auVar83);
                        pRVar41 = (RTCRayN *)(ulong)(uVar49 ^ 0xf);
                        if ((uVar49 ^ 0xf) == 0) {
                          auVar83 = auVar83 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var40 = context->args->filter;
                          if ((p_Var40 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var40)(&local_328);
                            context = local_508;
                          }
                          auVar102._0_4_ = -(uint)((int)local_468 == 0);
                          auVar102._4_4_ = -(uint)(local_468._4_4_ == 0);
                          auVar102._8_4_ = -(uint)((int)uStack_460 == 0);
                          auVar102._12_4_ = -(uint)(uStack_460._4_4_ == 0);
                          auVar83 = auVar102 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_328.ray + 0x80) =
                               ~auVar102 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_328.ray + 0x80) & auVar102;
                          pRVar41 = local_328.ray;
                        }
                        auVar84._0_4_ = auVar83._0_4_ << 0x1f;
                        auVar84._4_4_ = auVar83._4_4_ << 0x1f;
                        auVar84._8_4_ = auVar83._8_4_ << 0x1f;
                        auVar84._12_4_ = auVar83._12_4_ << 0x1f;
                        iVar42 = movmskps((int)pRVar41,auVar84);
                        if (iVar42 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar55;
                        }
                        uVar38 = (ulong)CONCAT31((int3)((uint)iVar42 >> 8),(char)iVar42 != '\0');
                      }
                      local_52c = (uint)(byte)((byte)local_52c | (byte)uVar38);
                      uVar44 = (ulong)local_52c;
                      pLVar45 = local_450;
                    }
                  }
                  break;
                }
                uVar38 = uVar38 - 1;
              } while (uVar38 != 0);
            }
            else {
              bVar18 = false;
            }
          }
        }
      }
    } while (bVar18);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }